

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  int iVar99;
  undefined4 uVar100;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  vint4 bi_1;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vint4 bi;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  float fVar119;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  vint4 ai_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vfloat4 b0_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  float fVar182;
  float fVar183;
  vint4 ai_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar184;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  __m128 a;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  vfloat4 a0_2;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar213;
  float fVar223;
  float fVar224;
  vfloat4 a0_3;
  undefined1 auVar214 [16];
  float fVar225;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar241;
  vfloat4 b0_2;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  vfloat4 b0_3;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 uStack_220;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar27;
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  float fVar134;
  float fVar143;
  undefined1 auVar252 [32];
  
  uVar26 = (ulong)(byte)prim[1];
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 4 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 5 + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 6 + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xf + 6)));
  lVar29 = uVar26 * 0x25;
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x11 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1a + 6)));
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1b + 6)));
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x1c + 6)));
  uVar100 = *(undefined4 *)(prim + lVar29 + 0x12);
  auVar253._4_4_ = uVar100;
  auVar253._0_4_ = uVar100;
  auVar253._8_4_ = uVar100;
  auVar253._12_4_ = uVar100;
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar38 = vsubps_avx512vl(auVar53,*(undefined1 (*) [16])(prim + lVar29 + 6));
  fVar144 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar29 + 0x16)) *
            *(float *)(prim + lVar29 + 0x1a);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar26 * 7 + 6);
  auVar57 = vpmovsxwd_avx(auVar53);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar58 = vpmovsxwd_avx(auVar56);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar26 * 9 + 6);
  auVar59 = vpmovsxwd_avx(auVar61);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar26 * 0xd + 6);
  auVar60 = vpmovsxwd_avx(auVar54);
  auVar39 = vpbroadcastd_avx512vl();
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar26 * 0x12 + 6);
  auVar40 = vpmovsxwd_avx512vl(auVar62);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar26 * 0x16 + 6);
  auVar41 = vpmovsxwd_avx512vl(auVar44);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar26 * 0x14 + 6);
  auVar42 = vpmovsxwd_avx512vl(auVar43);
  auVar262 = ZEXT1664(auVar42);
  auVar53 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar53 = vinsertps_avx512f(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar43 = vmulps_avx512vl(auVar253,auVar38);
  auVar44 = vmulps_avx512vl(auVar253,auVar53);
  auVar45 = vcvtdq2ps_avx512vl(auVar45);
  auVar46 = vcvtdq2ps_avx512vl(auVar46);
  auVar266 = ZEXT1664(auVar46);
  auVar47 = vcvtdq2ps_avx512vl(auVar47);
  auVar48 = vcvtdq2ps_avx512vl(auVar48);
  auVar49 = vcvtdq2ps_avx512vl(auVar49);
  auVar53 = vcvtdq2ps_avx(auVar50);
  auVar56 = vcvtdq2ps_avx(auVar51);
  auVar61 = vcvtdq2ps_avx(auVar52);
  auVar54 = vcvtdq2ps_avx(auVar55);
  uVar100 = auVar44._0_4_;
  auVar207._4_4_ = uVar100;
  auVar207._0_4_ = uVar100;
  auVar207._8_4_ = uVar100;
  auVar207._12_4_ = uVar100;
  auVar62 = vshufps_avx(auVar44,auVar44,0x55);
  auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
  auVar50 = vmulps_avx512vl(auVar44,auVar47);
  auVar66._0_4_ = auVar44._0_4_ * auVar53._0_4_;
  auVar66._4_4_ = auVar44._4_4_ * auVar53._4_4_;
  auVar66._8_4_ = auVar44._8_4_ * auVar53._8_4_;
  auVar66._12_4_ = auVar44._12_4_ * auVar53._12_4_;
  auVar65._0_4_ = auVar54._0_4_ * auVar44._0_4_;
  auVar65._4_4_ = auVar54._4_4_ * auVar44._4_4_;
  auVar65._8_4_ = auVar54._8_4_ * auVar44._8_4_;
  auVar65._12_4_ = auVar54._12_4_ * auVar44._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar50,auVar62,auVar46);
  auVar50 = vfmadd231ps_avx512vl(auVar66,auVar62,auVar49);
  auVar62 = vfmadd231ps_fma(auVar65,auVar61,auVar62);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar207,auVar45);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar207,auVar48);
  auVar62 = vfmadd231ps_fma(auVar62,auVar56,auVar207);
  auVar51 = vbroadcastss_avx512vl(auVar43);
  auVar52 = vshufps_avx512vl(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx512vl(auVar43,auVar43,0xaa);
  auVar47 = vmulps_avx512vl(auVar43,auVar47);
  auVar53 = vmulps_avx512vl(auVar43,auVar53);
  auVar54 = vmulps_avx512vl(auVar43,auVar54);
  auVar43 = vfmadd231ps_avx512vl(auVar47,auVar52,auVar46);
  auVar46 = vfmadd231ps_avx512vl(auVar53,auVar52,auVar49);
  auVar53 = vfmadd231ps_fma(auVar54,auVar52,auVar61);
  auVar52 = vfmadd231ps_avx512vl(auVar43,auVar51,auVar45);
  auVar55 = vfmadd231ps_avx512vl(auVar46,auVar51,auVar48);
  auVar51 = vfmadd231ps_fma(auVar53,auVar51,auVar56);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar269 = ZEXT1664(auVar53);
  auVar56 = vandps_avx512vl(auVar44,auVar53);
  auVar230._8_4_ = 0x219392ef;
  auVar230._0_8_ = 0x219392ef219392ef;
  auVar230._12_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar56,auVar230,1);
  bVar33 = (bool)((byte)uVar32 & 1);
  auVar38._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._0_4_;
  bVar33 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._4_4_;
  bVar33 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._8_4_;
  bVar33 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar44._12_4_;
  auVar56 = vandps_avx512vl(auVar50,auVar53);
  uVar32 = vcmpps_avx512vl(auVar56,auVar230,1);
  bVar33 = (bool)((byte)uVar32 & 1);
  auVar63._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar50._0_4_;
  bVar33 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar50._4_4_;
  bVar33 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar50._8_4_;
  bVar33 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar50._12_4_;
  auVar53 = vandps_avx512vl(auVar62,auVar53);
  uVar32 = vcmpps_avx512vl(auVar53,auVar230,1);
  bVar33 = (bool)((byte)uVar32 & 1);
  auVar64._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar62._0_4_;
  bVar33 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar62._4_4_;
  bVar33 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar62._8_4_;
  bVar33 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar62._12_4_;
  auVar56 = vrcp14ps_avx512vl(auVar38);
  auVar231._8_4_ = 0x3f800000;
  auVar231._0_8_ = 0x3f8000003f800000;
  auVar231._12_4_ = 0x3f800000;
  auVar53 = vfnmadd213ps_fma(auVar38,auVar56,auVar231);
  auVar61 = vfmadd132ps_fma(auVar53,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar63);
  auVar53 = vfnmadd213ps_fma(auVar63,auVar56,auVar231);
  auVar54 = vfmadd132ps_fma(auVar53,auVar56,auVar56);
  auVar56 = vrcp14ps_avx512vl(auVar64);
  auVar53 = vfnmadd213ps_fma(auVar64,auVar56,auVar231);
  auVar62 = vfmadd132ps_fma(auVar53,auVar56,auVar56);
  auVar135._4_4_ = fVar144;
  auVar135._0_4_ = fVar144;
  auVar135._8_4_ = fVar144;
  auVar135._12_4_ = fVar144;
  auVar53 = vcvtdq2ps_avx(auVar57);
  auVar56 = vcvtdq2ps_avx(auVar58);
  auVar56 = vsubps_avx(auVar56,auVar53);
  auVar44 = vfmadd213ps_fma(auVar56,auVar135,auVar53);
  auVar53 = vcvtdq2ps_avx(auVar59);
  auVar56 = vcvtdq2ps_avx(auVar60);
  auVar56 = vsubps_avx(auVar56,auVar53);
  auVar43 = vfmadd213ps_fma(auVar56,auVar135,auVar53);
  auVar56 = vcvtdq2ps_avx512vl(auVar40);
  auVar53 = vcvtdq2ps_avx512vl(auVar41);
  auVar53 = vsubps_avx(auVar53,auVar56);
  auVar50 = vfmadd213ps_fma(auVar53,auVar135,auVar56);
  auVar47 = vcvtdq2ps_avx512vl(auVar42);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 * 0x18 + 6);
  auVar53 = vpmovsxwd_avx(auVar45);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar56 = vsubps_avx(auVar53,auVar47);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 0x1d + 6);
  auVar53 = vpmovsxwd_avx(auVar46);
  auVar45 = vfmadd213ps_fma(auVar56,auVar135,auVar47);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar26 * 0x21 + 6);
  auVar56 = vpmovsxwd_avx(auVar47);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,auVar53);
  auVar46 = vfmadd213ps_fma(auVar56,auVar135,auVar53);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar26 * 0x1f + 6);
  auVar53 = vpmovsxwd_avx(auVar48);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar26 * 0x23 + 6);
  auVar56 = vpmovsxwd_avx(auVar49);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,auVar53);
  auVar56 = vfmadd213ps_fma(auVar56,auVar135,auVar53);
  auVar53 = vsubps_avx512vl(auVar44,auVar52);
  auVar60._0_4_ = auVar61._0_4_ * auVar53._0_4_;
  auVar60._4_4_ = auVar61._4_4_ * auVar53._4_4_;
  auVar60._8_4_ = auVar61._8_4_ * auVar53._8_4_;
  auVar60._12_4_ = auVar61._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx512vl(auVar43,auVar52);
  auVar59._0_4_ = auVar61._0_4_ * auVar53._0_4_;
  auVar59._4_4_ = auVar61._4_4_ * auVar53._4_4_;
  auVar59._8_4_ = auVar61._8_4_ * auVar53._8_4_;
  auVar59._12_4_ = auVar61._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar50,auVar55);
  auVar41._0_4_ = auVar54._0_4_ * auVar53._0_4_;
  auVar41._4_4_ = auVar54._4_4_ * auVar53._4_4_;
  auVar41._8_4_ = auVar54._8_4_ * auVar53._8_4_;
  auVar41._12_4_ = auVar54._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar45,auVar55);
  auVar58._0_4_ = auVar54._0_4_ * auVar53._0_4_;
  auVar58._4_4_ = auVar54._4_4_ * auVar53._4_4_;
  auVar58._8_4_ = auVar54._8_4_ * auVar53._8_4_;
  auVar58._12_4_ = auVar54._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar46,auVar51);
  auVar42._0_4_ = auVar62._0_4_ * auVar53._0_4_;
  auVar42._4_4_ = auVar62._4_4_ * auVar53._4_4_;
  auVar42._8_4_ = auVar62._8_4_ * auVar53._8_4_;
  auVar42._12_4_ = auVar62._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar56,auVar51);
  auVar57._0_4_ = auVar62._0_4_ * auVar53._0_4_;
  auVar57._4_4_ = auVar62._4_4_ * auVar53._4_4_;
  auVar57._8_4_ = auVar62._8_4_ * auVar53._8_4_;
  auVar57._12_4_ = auVar62._12_4_ * auVar53._12_4_;
  auVar53 = vpminsd_avx(auVar60,auVar59);
  auVar56 = vpminsd_avx(auVar41,auVar58);
  auVar53 = vmaxps_avx(auVar53,auVar56);
  auVar56 = vpminsd_avx(auVar42,auVar57);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar50._4_4_ = uVar100;
  auVar50._0_4_ = uVar100;
  auVar50._8_4_ = uVar100;
  auVar50._12_4_ = uVar100;
  auVar56 = vmaxps_avx512vl(auVar56,auVar50);
  auVar53 = vmaxps_avx(auVar53,auVar56);
  auVar51._8_4_ = 0x3f7ffffa;
  auVar51._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar51._12_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar53,auVar51);
  auVar53 = vpmaxsd_avx(auVar60,auVar59);
  auVar56 = vpmaxsd_avx(auVar41,auVar58);
  auVar53 = vminps_avx(auVar53,auVar56);
  auVar56 = vpmaxsd_avx(auVar42,auVar57);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar52._4_4_ = uVar100;
  auVar52._0_4_ = uVar100;
  auVar52._8_4_ = uVar100;
  auVar52._12_4_ = uVar100;
  auVar56 = vminps_avx512vl(auVar56,auVar52);
  auVar53 = vminps_avx(auVar53,auVar56);
  auVar55._8_4_ = 0x3f800003;
  auVar55._0_8_ = 0x3f8000033f800003;
  auVar55._12_4_ = 0x3f800003;
  auVar53 = vmulps_avx512vl(auVar53,auVar55);
  uVar18 = vcmpps_avx512vl(local_3c0,auVar53,2);
  uVar19 = vpcmpgtd_avx512vl(auVar39,_DAT_01f4ad30);
  uVar32 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar18 & 0xf & (byte)uVar19));
  local_200 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar53 = vpxord_avx512vl(auVar40,auVar40);
  auVar263 = ZEXT1664(auVar53);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar268 = ZEXT1664(auVar53);
LAB_018c2bc1:
  if (uVar32 == 0) {
LAB_018c4ad8:
    return uVar32 != 0;
  }
  lVar29 = 0;
  for (uVar26 = uVar32; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  fVar144 = (pGVar8->time_range).lower;
  fVar144 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar144) / ((pGVar8->time_range).upper - fVar144));
  auVar53 = vroundss_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),9);
  auVar56 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar53 = vminss_avx(auVar53,auVar56);
  auVar60 = auVar263._0_16_;
  auVar55 = vmaxss_avx512f(auVar60,auVar53);
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar29 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar31 = (long)(int)auVar55._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar31);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar31);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar26);
  lVar29 = uVar26 + 1;
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar29);
  lVar1 = uVar26 + 2;
  auVar61 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar26 + 3;
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar31);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar31);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar26);
  auVar44 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar29);
  auVar43 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar45 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar31);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar31);
  auVar46 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar26);
  auVar47 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar29);
  auVar48 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar49 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  local_1c0 = vpbroadcastd_avx512vl();
  lVar11 = *(long *)(lVar10 + 0x38 + lVar31);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar31);
  auVar50 = *(undefined1 (*) [16])(lVar11 + uVar26 * lVar10);
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar29 * lVar10);
  auVar52 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar85._16_16_ = local_1c0._16_16_;
  auVar55 = vsubss_avx512f(ZEXT416((uint)fVar144),auVar55);
  auVar85._0_16_ = vxorps_avx512vl(auVar266._0_16_,auVar266._0_16_);
  auVar57 = vmulps_avx512vl(auVar54,auVar85._0_16_);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar61,auVar85._0_16_);
  auVar58 = vpxord_avx512vl(auVar262._0_16_,auVar262._0_16_);
  auVar58 = vfmadd213ps_avx512vl(auVar58,auVar56,auVar57);
  auVar58 = vaddps_avx512vl(auVar53,auVar58);
  auVar41 = auVar268._0_16_;
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar41);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar53,auVar41);
  auVar59 = vmulps_avx512vl(auVar45,auVar85._0_16_);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar43,auVar85._0_16_);
  auVar60 = vxorps_avx512vl(auVar60,auVar60);
  auVar60 = vfmadd213ps_avx512vl(auVar60,auVar44,auVar59);
  auVar38 = vaddps_avx512vl(auVar62,auVar60);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar44,auVar41);
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar62,auVar41);
  auVar60 = vxorps_avx512vl(auVar60,auVar60);
  auVar60 = vfmadd213ps_avx512vl(auVar60,auVar61,auVar54);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar56,auVar85._0_16_);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar53,auVar85._0_16_);
  auVar54 = vmulps_avx512vl(auVar54,auVar41);
  auVar61 = vfnmadd231ps_avx512vl(auVar54,auVar41,auVar61);
  auVar56 = vfmadd231ps_avx512vl(auVar61,auVar85._0_16_,auVar56);
  auVar39 = vfnmadd231ps_avx512vl(auVar56,auVar85._0_16_,auVar53);
  auVar53 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar43,auVar45);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar44,auVar85._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar53,auVar62,auVar85._0_16_);
  auVar53 = vmulps_avx512vl(auVar45,auVar41);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar41,auVar43);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar85._0_16_,auVar44);
  auVar44 = vfnmadd231ps_avx512vl(auVar53,auVar85._0_16_,auVar62);
  auVar53 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar56 = vshufps_avx512vl(auVar38,auVar38,0xc9);
  fVar119 = auVar57._0_4_;
  auVar145._0_4_ = fVar119 * auVar56._0_4_;
  fVar131 = auVar57._4_4_;
  auVar145._4_4_ = fVar131 * auVar56._4_4_;
  fVar132 = auVar57._8_4_;
  auVar145._8_4_ = fVar132 * auVar56._8_4_;
  fVar133 = auVar57._12_4_;
  auVar145._12_4_ = fVar133 * auVar56._12_4_;
  auVar56 = vfmsub231ps_avx512vl(auVar145,auVar53,auVar38);
  auVar61 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  auVar164._0_4_ = fVar119 * auVar56._0_4_;
  auVar164._4_4_ = fVar131 * auVar56._4_4_;
  auVar164._8_4_ = fVar132 * auVar56._8_4_;
  auVar164._12_4_ = fVar133 * auVar56._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar164,auVar53,auVar59);
  auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar56 = vshufps_avx(auVar40,auVar40,0xc9);
  fVar144 = auVar39._0_4_;
  auVar185._0_4_ = auVar56._0_4_ * fVar144;
  fVar228 = auVar39._4_4_;
  auVar185._4_4_ = auVar56._4_4_ * fVar228;
  fVar213 = auVar39._8_4_;
  auVar185._8_4_ = auVar56._8_4_ * fVar213;
  fVar223 = auVar39._12_4_;
  auVar185._12_4_ = auVar56._12_4_ * fVar223;
  auVar56 = vfmsub231ps_fma(auVar185,auVar53,auVar40);
  auVar62 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar186._0_4_ = auVar56._0_4_ * fVar144;
  auVar186._4_4_ = auVar56._4_4_ * fVar228;
  auVar186._8_4_ = auVar56._8_4_ * fVar213;
  auVar186._12_4_ = auVar56._12_4_ * fVar223;
  auVar53 = vfmsub231ps_fma(auVar186,auVar53,auVar44);
  auVar44 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vdpps_avx(auVar61,auVar61,0x7f);
  auVar82._4_28_ = auVar85._4_28_;
  auVar82._0_4_ = auVar53._0_4_;
  auVar56 = vrsqrt14ss_avx512f(auVar85._0_16_,auVar82._0_16_);
  auVar43 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar53,ZEXT416(0x3f000000));
  auVar45 = vmulss_avx512f(auVar45,auVar56);
  auVar56 = vmulss_avx512f(auVar45,ZEXT416((uint)(auVar56._0_4_ * auVar56._0_4_)));
  auVar56 = vsubss_avx512f(auVar43,auVar56);
  auVar194._0_4_ = auVar56._0_4_;
  auVar194._4_4_ = auVar194._0_4_;
  auVar194._8_4_ = auVar194._0_4_;
  auVar194._12_4_ = auVar194._0_4_;
  auVar43 = vmulps_avx512vl(auVar61,auVar194);
  auVar56 = vdpps_avx(auVar61,auVar54,0x7f);
  auVar45 = vbroadcastss_avx512vl(auVar53);
  auVar54 = vmulps_avx512vl(auVar45,auVar54);
  fVar224 = auVar56._0_4_;
  auVar146._0_4_ = fVar224 * auVar61._0_4_;
  auVar146._4_4_ = fVar224 * auVar61._4_4_;
  auVar146._8_4_ = fVar224 * auVar61._8_4_;
  auVar146._12_4_ = fVar224 * auVar61._12_4_;
  auVar61 = vsubps_avx(auVar54,auVar146);
  auVar56 = vrcp14ss_avx512f(auVar85._0_16_,auVar82._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar56,ZEXT416(0x40000000));
  fVar224 = auVar56._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar62,auVar62,0x7f);
  auVar67._16_16_ = auVar85._16_16_;
  auVar67._0_16_ = auVar85._0_16_;
  auVar84._4_28_ = auVar67._4_28_;
  auVar84._0_4_ = auVar53._0_4_;
  auVar56 = vrsqrt14ss_avx512f(auVar85._0_16_,auVar84._0_16_);
  auVar54 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar53,ZEXT416(0x3f000000));
  fVar134 = auVar56._0_4_;
  fVar143 = auVar54._0_4_ - auVar45._0_4_ * fVar134 * fVar134 * fVar134;
  auVar195._0_4_ = fVar143 * auVar62._0_4_;
  auVar195._4_4_ = fVar143 * auVar62._4_4_;
  auVar195._8_4_ = fVar143 * auVar62._8_4_;
  auVar195._12_4_ = fVar143 * auVar62._12_4_;
  auVar56 = vdpps_avx(auVar62,auVar44,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar53);
  auVar54 = vmulps_avx512vl(auVar54,auVar44);
  fVar134 = auVar56._0_4_;
  auVar40._0_4_ = fVar134 * auVar62._0_4_;
  auVar40._4_4_ = fVar134 * auVar62._4_4_;
  auVar40._8_4_ = fVar134 * auVar62._8_4_;
  auVar40._12_4_ = fVar134 * auVar62._12_4_;
  auVar56 = vsubps_avx(auVar54,auVar40);
  auVar54 = vrcp14ss_avx512f(auVar85._0_16_,auVar84._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar54,ZEXT416(0x40000000));
  fVar134 = auVar54._0_4_ * auVar53._0_4_;
  auVar54 = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar62 = vmulps_avx512vl(auVar54,auVar43);
  auVar44 = vsubps_avx512vl(auVar58,auVar62);
  auVar53 = vshufps_avx(auVar57,auVar57,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar43);
  auVar136._0_4_ = auVar53._0_4_ + auVar54._0_4_ * auVar194._0_4_ * fVar224 * auVar61._0_4_;
  auVar136._4_4_ = auVar53._4_4_ + auVar54._4_4_ * auVar194._0_4_ * fVar224 * auVar61._4_4_;
  auVar136._8_4_ = auVar53._8_4_ + auVar54._8_4_ * auVar194._0_4_ * fVar224 * auVar61._8_4_;
  auVar136._12_4_ = auVar53._12_4_ + auVar54._12_4_ * auVar194._0_4_ * fVar224 * auVar61._12_4_;
  auVar53 = vsubps_avx(auVar57,auVar136);
  auVar43 = vaddps_avx512vl(auVar58,auVar62);
  auVar61 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar232._0_4_ = auVar195._0_4_ * auVar61._0_4_;
  auVar232._4_4_ = auVar195._4_4_ * auVar61._4_4_;
  auVar232._8_4_ = auVar195._8_4_ * auVar61._8_4_;
  auVar232._12_4_ = auVar195._12_4_ * auVar61._12_4_;
  auVar45 = vsubps_avx512vl(auVar60,auVar232);
  auVar54 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar62 = vmulps_avx512vl(auVar54,auVar195);
  auVar147._0_4_ = auVar62._0_4_ + auVar61._0_4_ * fVar143 * auVar56._0_4_ * fVar134;
  auVar147._4_4_ = auVar62._4_4_ + auVar61._4_4_ * fVar143 * auVar56._4_4_ * fVar134;
  auVar147._8_4_ = auVar62._8_4_ + auVar61._8_4_ * fVar143 * auVar56._8_4_ * fVar134;
  auVar147._12_4_ = auVar62._12_4_ + auVar61._12_4_ * fVar143 * auVar56._12_4_ * fVar134;
  auVar56 = vsubps_avx(auVar39,auVar147);
  auVar57 = vaddps_avx512vl(auVar60,auVar232);
  auVar175._0_4_ = auVar44._0_4_ + auVar53._0_4_ * 0.33333334;
  auVar175._4_4_ = auVar44._4_4_ + auVar53._4_4_ * 0.33333334;
  auVar175._8_4_ = auVar44._8_4_ + auVar53._8_4_ * 0.33333334;
  auVar175._12_4_ = auVar44._12_4_ + auVar53._12_4_ * 0.33333334;
  auVar148._0_4_ = auVar56._0_4_ * 0.33333334;
  auVar148._4_4_ = auVar56._4_4_ * 0.33333334;
  auVar148._8_4_ = auVar56._8_4_ * 0.33333334;
  auVar148._12_4_ = auVar56._12_4_ * 0.33333334;
  auVar62 = vsubps_avx(auVar45,auVar148);
  auVar149._0_4_ = (fVar119 + auVar136._0_4_) * 0.33333334;
  auVar149._4_4_ = (fVar131 + auVar136._4_4_) * 0.33333334;
  auVar149._8_4_ = (fVar132 + auVar136._8_4_) * 0.33333334;
  auVar149._12_4_ = (fVar133 + auVar136._12_4_) * 0.33333334;
  auVar58 = vaddps_avx512vl(auVar43,auVar149);
  auVar165._0_4_ = (fVar144 + auVar147._0_4_) * 0.33333334;
  auVar165._4_4_ = (fVar228 + auVar147._4_4_) * 0.33333334;
  auVar165._8_4_ = (fVar213 + auVar147._8_4_) * 0.33333334;
  auVar165._12_4_ = (fVar223 + auVar147._12_4_) * 0.33333334;
  auVar59 = vsubps_avx512vl(auVar57,auVar165);
  auVar53 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar56 = vmulps_avx512vl(auVar49,auVar85._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar48,auVar85._0_16_);
  auVar61 = vxorps_avx512vl(auVar54,auVar54);
  auVar61 = vfmadd213ps_avx512vl(auVar61,auVar47,auVar56);
  auVar38 = vaddps_avx512vl(auVar46,auVar61);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar47,auVar41);
  auVar39 = vfnmadd231ps_avx512vl(auVar56,auVar46,auVar41);
  auVar56 = vmulps_avx512vl(auVar53,auVar85._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar52,auVar85._0_16_);
  auVar61 = vxorps_avx512vl(auVar60,auVar60);
  auVar61 = vfmadd213ps_avx512vl(auVar61,auVar51,auVar56);
  auVar54 = vaddps_avx512vl(auVar50,auVar61);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar51,auVar41);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar50,auVar41);
  auVar61 = vxorps_avx512vl(auVar61,auVar61);
  auVar61 = vfmadd213ps_avx512vl(auVar61,auVar48,auVar49);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar47,auVar85._0_16_);
  auVar60 = vfmadd231ps_avx512vl(auVar61,auVar46,auVar85._0_16_);
  auVar61 = vmulps_avx512vl(auVar49,auVar41);
  auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar41,auVar48);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar85._0_16_,auVar47);
  auVar46 = vfnmadd231ps_avx512vl(auVar61,auVar85._0_16_,auVar46);
  auVar61 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar52,auVar53);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar51,auVar85._0_16_);
  auVar47 = vfmadd231ps_avx512vl(auVar61,auVar50,auVar85._0_16_);
  auVar53 = vmulps_avx512vl(auVar53,auVar41);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar41,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar85._0_16_,auVar51);
  auVar48 = vfnmadd231ps_avx512vl(auVar53,auVar85._0_16_,auVar50);
  auVar53 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar61 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  fVar213 = auVar39._0_4_;
  auVar246._0_4_ = fVar213 * auVar61._0_4_;
  fVar223 = auVar39._4_4_;
  auVar246._4_4_ = fVar223 * auVar61._4_4_;
  fVar224 = auVar39._8_4_;
  auVar246._8_4_ = fVar224 * auVar61._8_4_;
  fVar134 = auVar39._12_4_;
  auVar246._12_4_ = fVar134 * auVar61._12_4_;
  auVar61 = vfmsub231ps_avx512vl(auVar246,auVar53,auVar54);
  auVar61 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar54 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  auVar254._0_4_ = fVar213 * auVar54._0_4_;
  auVar254._4_4_ = fVar223 * auVar54._4_4_;
  auVar254._8_4_ = fVar224 * auVar54._8_4_;
  auVar254._12_4_ = fVar134 * auVar54._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar254,auVar53,auVar56);
  auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar56 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar53 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar53 = vmulps_avx512vl(auVar46,auVar53);
  auVar53 = vfmsub231ps_avx512vl(auVar53,auVar56,auVar47);
  auVar47 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  auVar49 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar53 = vdpps_avx(auVar61,auVar61,0x7f);
  auVar49 = vmulps_avx512vl(auVar46,auVar49);
  auVar56 = vfmsub231ps_avx512vl(auVar49,auVar56,auVar48);
  auVar48 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  auVar69._16_16_ = auVar85._16_16_;
  auVar69._0_16_ = auVar85._0_16_;
  auVar68._4_28_ = auVar69._4_28_;
  auVar68._0_4_ = auVar53._0_4_;
  auVar56 = vrsqrt14ss_avx512f(auVar85._0_16_,auVar68._0_16_);
  auVar49 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar53,ZEXT416(0x3f000000));
  auVar50 = vmulss_avx512f(auVar50,auVar56);
  auVar56 = vmulss_avx512f(auVar56,auVar56);
  auVar56 = vmulss_avx512f(auVar50,auVar56);
  auVar56 = vsubss_avx512f(auVar49,auVar56);
  auVar49 = vbroadcastss_avx512vl(auVar56);
  auVar50 = vmulps_avx512vl(auVar61,auVar49);
  auVar56 = vdpps_avx(auVar61,auVar54,0x7f);
  auVar51 = vbroadcastss_avx512vl(auVar53);
  auVar54 = vmulps_avx512vl(auVar51,auVar54);
  fVar144 = auVar56._0_4_;
  auVar150._0_4_ = auVar61._0_4_ * fVar144;
  auVar150._4_4_ = auVar61._4_4_ * fVar144;
  auVar150._8_4_ = auVar61._8_4_ * fVar144;
  auVar150._12_4_ = auVar61._12_4_ * fVar144;
  auVar56 = vsubps_avx(auVar54,auVar150);
  auVar61 = vrcp14ss_avx512f(auVar85._0_16_,auVar68._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar61,ZEXT416(0x40000000));
  fVar144 = auVar61._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar47,auVar47,0x7f);
  auVar106._0_4_ = fVar144 * auVar56._0_4_;
  auVar106._4_4_ = fVar144 * auVar56._4_4_;
  auVar106._8_4_ = fVar144 * auVar56._8_4_;
  auVar106._12_4_ = fVar144 * auVar56._12_4_;
  auVar61 = vmulps_avx512vl(auVar49,auVar106);
  auVar71._16_16_ = auVar85._16_16_;
  auVar71._0_16_ = auVar85._0_16_;
  auVar70._4_28_ = auVar71._4_28_;
  auVar70._0_4_ = auVar53._0_4_;
  auVar56 = vrsqrt14ss_avx512f(auVar85._0_16_,auVar70._0_16_);
  auVar54 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar53,ZEXT416(0x3f000000));
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar49 = vmulss_avx512f(auVar49,auVar56);
  auVar56 = vmulss_avx512f(auVar49,ZEXT416((uint)(auVar56._0_4_ * auVar56._0_4_)));
  fVar228 = auVar54._0_4_ - auVar56._0_4_;
  auVar255._0_4_ = auVar47._0_4_ * fVar228;
  auVar255._4_4_ = auVar47._4_4_ * fVar228;
  auVar255._8_4_ = auVar47._8_4_ * fVar228;
  auVar255._12_4_ = auVar47._12_4_ * fVar228;
  auVar56 = vdpps_avx(auVar47,auVar48,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar53);
  auVar54 = vmulps_avx512vl(auVar54,auVar48);
  fVar144 = auVar56._0_4_;
  auVar166._0_4_ = auVar47._0_4_ * fVar144;
  auVar166._4_4_ = auVar47._4_4_ * fVar144;
  auVar166._8_4_ = auVar47._8_4_ * fVar144;
  auVar166._12_4_ = auVar47._12_4_ * fVar144;
  auVar56 = vsubps_avx(auVar54,auVar166);
  auVar54 = vrcp14ss_avx512f(auVar85._0_16_,auVar70._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar54,ZEXT416(0x40000000));
  auVar270 = ZEXT464(0x3f800000);
  fVar144 = auVar53._0_4_ * auVar54._0_4_;
  auVar54 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar47 = vmulps_avx512vl(auVar54,auVar50);
  auVar48 = vsubps_avx512vl(auVar38,auVar47);
  auVar53 = vshufps_avx(auVar39,auVar39,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar50);
  auVar107._0_4_ = auVar53._0_4_ + auVar54._0_4_ * auVar61._0_4_;
  auVar107._4_4_ = auVar53._4_4_ + auVar54._4_4_ * auVar61._4_4_;
  auVar107._8_4_ = auVar53._8_4_ + auVar54._8_4_ * auVar61._8_4_;
  auVar107._12_4_ = auVar53._12_4_ + auVar54._12_4_ * auVar61._12_4_;
  auVar53 = vsubps_avx(auVar39,auVar107);
  auVar61 = vaddps_avx512vl(auVar38,auVar47);
  auVar54 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar233._0_4_ = auVar54._0_4_ * auVar255._0_4_;
  auVar233._4_4_ = auVar54._4_4_ * auVar255._4_4_;
  auVar233._8_4_ = auVar54._8_4_ * auVar255._8_4_;
  auVar233._12_4_ = auVar54._12_4_ * auVar255._12_4_;
  auVar47 = vsubps_avx512vl(auVar60,auVar233);
  auVar49 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar49 = vmulps_avx512vl(auVar49,auVar255);
  auVar151._0_4_ = auVar49._0_4_ + auVar54._0_4_ * fVar228 * auVar56._0_4_ * fVar144;
  auVar151._4_4_ = auVar49._4_4_ + auVar54._4_4_ * fVar228 * auVar56._4_4_ * fVar144;
  auVar151._8_4_ = auVar49._8_4_ + auVar54._8_4_ * fVar228 * auVar56._8_4_ * fVar144;
  auVar151._12_4_ = auVar49._12_4_ + auVar54._12_4_ * fVar228 * auVar56._12_4_ * fVar144;
  auVar56 = vsubps_avx(auVar46,auVar151);
  auVar54 = vaddps_avx512vl(auVar60,auVar233);
  auVar167._0_4_ = auVar48._0_4_ + auVar53._0_4_ * 0.33333334;
  auVar167._4_4_ = auVar48._4_4_ + auVar53._4_4_ * 0.33333334;
  auVar167._8_4_ = auVar48._8_4_ + auVar53._8_4_ * 0.33333334;
  auVar167._12_4_ = auVar48._12_4_ + auVar53._12_4_ * 0.33333334;
  auVar196._0_4_ = auVar56._0_4_ * 0.33333334;
  auVar196._4_4_ = auVar56._4_4_ * 0.33333334;
  auVar196._8_4_ = auVar56._8_4_ * 0.33333334;
  auVar196._12_4_ = auVar56._12_4_ * 0.33333334;
  auVar53 = vsubps_avx(auVar47,auVar196);
  auVar108._0_4_ = auVar61._0_4_ + (fVar213 + auVar107._0_4_) * 0.33333334;
  auVar108._4_4_ = auVar61._4_4_ + (fVar223 + auVar107._4_4_) * 0.33333334;
  auVar108._8_4_ = auVar61._8_4_ + (fVar224 + auVar107._8_4_) * 0.33333334;
  auVar108._12_4_ = auVar61._12_4_ + (fVar134 + auVar107._12_4_) * 0.33333334;
  auVar152._0_4_ = (auVar46._0_4_ + auVar151._0_4_) * 0.33333334;
  auVar152._4_4_ = (auVar46._4_4_ + auVar151._4_4_) * 0.33333334;
  auVar152._8_4_ = (auVar46._8_4_ + auVar151._8_4_) * 0.33333334;
  auVar152._12_4_ = (auVar46._12_4_ + auVar151._12_4_) * 0.33333334;
  auVar56 = vsubps_avx(auVar54,auVar152);
  auVar46 = vbroadcastss_avx512vl(auVar55);
  auVar49 = vsubss_avx512f(ZEXT416(0x3f800000),auVar55);
  auVar256._0_4_ = auVar49._0_4_;
  auVar256._4_4_ = auVar256._0_4_;
  auVar256._8_4_ = auVar256._0_4_;
  auVar256._12_4_ = auVar256._0_4_;
  auVar48 = vmulps_avx512vl(auVar46,auVar48);
  auVar49 = vmulps_avx512vl(auVar46,auVar167);
  auVar53 = vmulps_avx512vl(auVar46,auVar53);
  auVar247._0_4_ = auVar46._0_4_ * auVar47._0_4_;
  auVar247._4_4_ = auVar46._4_4_ * auVar47._4_4_;
  auVar247._8_4_ = auVar46._8_4_ * auVar47._8_4_;
  auVar247._12_4_ = auVar46._12_4_ * auVar47._12_4_;
  local_340 = vfmadd231ps_avx512vl(auVar48,auVar256,auVar44);
  local_350 = vfmadd231ps_avx512vl(auVar49,auVar256,auVar175);
  local_360 = vfmadd231ps_avx512vl(auVar53,auVar256,auVar62);
  local_370 = vfmadd231ps_fma(auVar247,auVar256,auVar45);
  auVar53 = vmulps_avx512vl(auVar46,auVar61);
  auVar61 = vmulps_avx512vl(auVar46,auVar108);
  auVar56 = vmulps_avx512vl(auVar46,auVar56);
  auVar242._0_4_ = auVar46._0_4_ * auVar54._0_4_;
  auVar242._4_4_ = auVar46._4_4_ * auVar54._4_4_;
  auVar242._8_4_ = auVar46._8_4_ * auVar54._8_4_;
  auVar242._12_4_ = auVar46._12_4_ * auVar54._12_4_;
  _local_380 = vfmadd231ps_avx512vl(auVar53,auVar256,auVar43);
  _local_390 = vfmadd231ps_avx512vl(auVar61,auVar256,auVar58);
  _local_3a0 = vfmadd231ps_avx512vl(auVar56,auVar256,auVar59);
  _local_3b0 = vfmadd231ps_fma(auVar242,auVar256,auVar57);
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_2c0 = vsubps_avx512vl(local_340,auVar53);
  uVar100 = local_2c0._0_4_;
  auVar109._4_4_ = uVar100;
  auVar109._0_4_ = uVar100;
  auVar109._8_4_ = uVar100;
  auVar109._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar61 = vshufps_avx(local_2c0,local_2c0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar144 = pre->ray_space[k].vz.field_0.m128[0];
  fVar228 = pre->ray_space[k].vz.field_0.m128[1];
  fVar213 = pre->ray_space[k].vz.field_0.m128[2];
  fVar223 = pre->ray_space[k].vz.field_0.m128[3];
  auVar101._0_4_ = fVar144 * auVar61._0_4_;
  auVar101._4_4_ = fVar228 * auVar61._4_4_;
  auVar101._8_4_ = fVar213 * auVar61._8_4_;
  auVar101._12_4_ = fVar223 * auVar61._12_4_;
  auVar56 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar5,auVar56);
  auVar43 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar109);
  local_2d0 = vsubps_avx512vl(local_350,auVar53);
  uVar100 = local_2d0._0_4_;
  auVar120._4_4_ = uVar100;
  auVar120._0_4_ = uVar100;
  auVar120._8_4_ = uVar100;
  auVar120._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar61 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar110._0_4_ = fVar144 * auVar61._0_4_;
  auVar110._4_4_ = fVar228 * auVar61._4_4_;
  auVar110._8_4_ = fVar213 * auVar61._8_4_;
  auVar110._12_4_ = fVar223 * auVar61._12_4_;
  auVar56 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar5,auVar56);
  auVar45 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar120);
  local_2e0 = vsubps_avx512vl(local_360,auVar53);
  uVar100 = local_2e0._0_4_;
  auVar121._4_4_ = uVar100;
  auVar121._0_4_ = uVar100;
  auVar121._8_4_ = uVar100;
  auVar121._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar61 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar187._0_4_ = auVar61._0_4_ * fVar144;
  auVar187._4_4_ = auVar61._4_4_ * fVar228;
  auVar187._8_4_ = auVar61._8_4_ * fVar213;
  auVar187._12_4_ = auVar61._12_4_ * fVar223;
  auVar56 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar56);
  auVar46 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar121);
  local_2f0 = vsubps_avx(local_370,auVar53);
  uVar100 = local_2f0._0_4_;
  auVar122._4_4_ = uVar100;
  auVar122._0_4_ = uVar100;
  auVar122._8_4_ = uVar100;
  auVar122._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar61 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar197._0_4_ = auVar61._0_4_ * fVar144;
  auVar197._4_4_ = auVar61._4_4_ * fVar228;
  auVar197._8_4_ = auVar61._8_4_ * fVar213;
  auVar197._12_4_ = auVar61._12_4_ * fVar223;
  auVar56 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar56);
  auVar47 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar122);
  local_300 = vsubps_avx512vl(_local_380,auVar53);
  uVar100 = local_300._0_4_;
  auVar123._4_4_ = uVar100;
  auVar123._0_4_ = uVar100;
  auVar123._8_4_ = uVar100;
  auVar123._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_300,local_300,0x55);
  auVar61 = vshufps_avx(local_300,local_300,0xaa);
  auVar208._0_4_ = auVar61._0_4_ * fVar144;
  auVar208._4_4_ = auVar61._4_4_ * fVar228;
  auVar208._8_4_ = auVar61._8_4_ * fVar213;
  auVar208._12_4_ = auVar61._12_4_ * fVar223;
  auVar56 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar56);
  auVar48 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar123);
  local_310 = vsubps_avx512vl(_local_390,auVar53);
  uVar100 = local_310._0_4_;
  auVar124._4_4_ = uVar100;
  auVar124._0_4_ = uVar100;
  auVar124._8_4_ = uVar100;
  auVar124._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_310,local_310,0x55);
  auVar61 = vshufps_avx(local_310,local_310,0xaa);
  auVar214._0_4_ = auVar61._0_4_ * fVar144;
  auVar214._4_4_ = auVar61._4_4_ * fVar228;
  auVar214._8_4_ = auVar61._8_4_ * fVar213;
  auVar214._12_4_ = auVar61._12_4_ * fVar223;
  auVar56 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar5,auVar56);
  auVar49 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar124);
  local_320 = vsubps_avx512vl(_local_3a0,auVar53);
  uVar100 = local_320._0_4_;
  auVar125._4_4_ = uVar100;
  auVar125._0_4_ = uVar100;
  auVar125._8_4_ = uVar100;
  auVar125._12_4_ = uVar100;
  auVar56 = vshufps_avx(local_320,local_320,0x55);
  auVar61 = vshufps_avx(local_320,local_320,0xaa);
  auVar234._0_4_ = auVar61._0_4_ * fVar144;
  auVar234._4_4_ = auVar61._4_4_ * fVar228;
  auVar234._8_4_ = auVar61._8_4_ * fVar213;
  auVar234._12_4_ = auVar61._12_4_ * fVar223;
  auVar56 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar5,auVar56);
  auVar50 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar4,auVar125);
  local_330 = vsubps_avx(_local_3b0,auVar53);
  uVar100 = local_330._0_4_;
  auVar112._4_4_ = uVar100;
  auVar112._0_4_ = uVar100;
  auVar112._8_4_ = uVar100;
  auVar112._12_4_ = uVar100;
  auVar53 = vshufps_avx(local_330,local_330,0x55);
  auVar56 = vshufps_avx(local_330,local_330,0xaa);
  auVar168._0_4_ = fVar144 * auVar56._0_4_;
  auVar168._4_4_ = fVar228 * auVar56._4_4_;
  auVar168._8_4_ = fVar213 * auVar56._8_4_;
  auVar168._12_4_ = fVar223 * auVar56._12_4_;
  auVar53 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar53);
  auVar51 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar4,auVar112);
  auVar61 = vmovlhps_avx(auVar43,auVar48);
  auVar54 = vmovlhps_avx(auVar45,auVar49);
  auVar62 = vmovlhps_avx(auVar46,auVar50);
  _local_2a0 = vmovlhps_avx512f(auVar47,auVar51);
  auVar56 = vminps_avx(auVar61,auVar54);
  auVar53 = vmaxps_avx(auVar61,auVar54);
  auVar44 = vminps_avx512vl(auVar62,_local_2a0);
  auVar56 = vminps_avx(auVar56,auVar44);
  auVar44 = vmaxps_avx512vl(auVar62,_local_2a0);
  auVar53 = vmaxps_avx(auVar53,auVar44);
  auVar44 = vshufpd_avx(auVar56,auVar56,3);
  auVar56 = vminps_avx(auVar56,auVar44);
  auVar44 = vshufpd_avx(auVar53,auVar53,3);
  auVar53 = vmaxps_avx(auVar53,auVar44);
  auVar56 = vandps_avx512vl(auVar56,auVar269._0_16_);
  auVar53 = vandps_avx512vl(auVar53,auVar269._0_16_);
  auVar53 = vmaxps_avx(auVar56,auVar53);
  auVar56 = vmovshdup_avx(auVar53);
  auVar53 = vmaxss_avx(auVar56,auVar53);
  auVar56 = vmovddup_avx512vl(auVar43);
  auVar44 = vmovddup_avx512vl(auVar45);
  auVar188._0_8_ = auVar46._0_8_;
  auVar188._8_8_ = auVar188._0_8_;
  auVar198._0_8_ = auVar47._0_8_;
  auVar198._8_8_ = auVar198._0_8_;
  local_2b0 = ZEXT416((uint)(auVar53._0_4_ * 9.536743e-07));
  local_240 = vbroadcastss_avx512vl(local_2b0);
  auVar53 = vxorps_avx512vl(local_240._0_16_,auVar52);
  local_260 = vbroadcastss_avx512vl(auVar53);
  bVar33 = false;
  uVar26 = 0;
  fVar144 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx(auVar54,auVar61);
  local_280 = vsubps_avx(auVar62,auVar54);
  local_290 = vsubps_avx512vl(_local_2a0,auVar62);
  local_3d0 = vsubps_avx512vl(_local_380,local_340);
  local_3e0 = vsubps_avx512vl(_local_390,local_350);
  local_3f0 = vsubps_avx512vl(_local_3a0,local_360);
  _local_400 = vsubps_avx(_local_3b0,local_370);
  local_1e0 = vpbroadcastd_avx512vl();
  auVar53 = ZEXT816(0x3f80000000000000);
  auVar39 = auVar53;
LAB_018c36ca:
  auVar43 = vshufps_avx(auVar39,auVar39,0x50);
  auVar248._8_4_ = 0x3f800000;
  auVar248._0_8_ = 0x3f8000003f800000;
  auVar248._12_4_ = 0x3f800000;
  auVar252._16_4_ = 0x3f800000;
  auVar252._0_16_ = auVar248;
  auVar252._20_4_ = 0x3f800000;
  auVar252._24_4_ = 0x3f800000;
  auVar252._28_4_ = 0x3f800000;
  auVar45 = vsubps_avx(auVar248,auVar43);
  fVar228 = auVar43._0_4_;
  fVar134 = auVar48._0_4_;
  auVar137._0_4_ = fVar134 * fVar228;
  fVar213 = auVar43._4_4_;
  fVar143 = auVar48._4_4_;
  auVar137._4_4_ = fVar143 * fVar213;
  fVar223 = auVar43._8_4_;
  auVar137._8_4_ = fVar134 * fVar223;
  fVar224 = auVar43._12_4_;
  auVar137._12_4_ = fVar143 * fVar224;
  fVar119 = auVar49._0_4_;
  auVar153._0_4_ = fVar119 * fVar228;
  fVar131 = auVar49._4_4_;
  auVar153._4_4_ = fVar131 * fVar213;
  auVar153._8_4_ = fVar119 * fVar223;
  auVar153._12_4_ = fVar131 * fVar224;
  fVar132 = auVar50._0_4_;
  auVar169._0_4_ = fVar132 * fVar228;
  fVar133 = auVar50._4_4_;
  auVar169._4_4_ = fVar133 * fVar213;
  auVar169._8_4_ = fVar132 * fVar223;
  auVar169._12_4_ = fVar133 * fVar224;
  fVar229 = auVar51._0_4_;
  auVar113._0_4_ = fVar229 * fVar228;
  fVar241 = auVar51._4_4_;
  auVar113._4_4_ = fVar241 * fVar213;
  auVar113._8_4_ = fVar229 * fVar223;
  auVar113._12_4_ = fVar241 * fVar224;
  auVar47 = vfmadd231ps_avx512vl(auVar137,auVar45,auVar56);
  auVar52 = vfmadd231ps_avx512vl(auVar153,auVar45,auVar44);
  auVar46 = vfmadd231ps_fma(auVar169,auVar45,auVar188);
  auVar45 = vfmadd231ps_fma(auVar113,auVar198,auVar45);
  auVar43 = vmovshdup_avx(auVar53);
  fVar213 = auVar53._0_4_;
  fVar228 = (auVar43._0_4_ - fVar213) * 0.04761905;
  auVar141._4_4_ = fVar213;
  auVar141._0_4_ = fVar213;
  auVar141._8_4_ = fVar213;
  auVar141._12_4_ = fVar213;
  auVar141._16_4_ = fVar213;
  auVar141._20_4_ = fVar213;
  auVar141._24_4_ = fVar213;
  auVar141._28_4_ = fVar213;
  auVar76._0_8_ = auVar43._0_8_;
  auVar76._8_8_ = auVar76._0_8_;
  auVar76._16_8_ = auVar76._0_8_;
  auVar76._24_8_ = auVar76._0_8_;
  auVar85 = vsubps_avx(auVar76,auVar141);
  uVar100 = auVar47._0_4_;
  auVar87._4_4_ = uVar100;
  auVar87._0_4_ = uVar100;
  auVar87._8_4_ = uVar100;
  auVar87._12_4_ = uVar100;
  auVar87._16_4_ = uVar100;
  auVar87._20_4_ = uVar100;
  auVar87._24_4_ = uVar100;
  auVar87._28_4_ = uVar100;
  auVar77._8_4_ = 1;
  auVar77._0_8_ = 0x100000001;
  auVar77._12_4_ = 1;
  auVar77._16_4_ = 1;
  auVar77._20_4_ = 1;
  auVar77._24_4_ = 1;
  auVar77._28_4_ = 1;
  auVar84 = ZEXT1632(auVar47);
  auVar82 = vpermps_avx2(auVar77,auVar84);
  auVar67 = vbroadcastss_avx512vl(auVar52);
  auVar83 = ZEXT1632(auVar52);
  auVar68 = vpermps_avx512vl(auVar77,auVar83);
  auVar69 = vbroadcastss_avx512vl(auVar46);
  auVar78 = ZEXT1632(auVar46);
  auVar70 = vpermps_avx512vl(auVar77,auVar78);
  auVar71 = vbroadcastss_avx512vl(auVar45);
  auVar81 = ZEXT1632(auVar45);
  auVar72 = vpermps_avx512vl(auVar77,auVar81);
  auVar211._4_4_ = fVar228;
  auVar211._0_4_ = fVar228;
  auVar211._8_4_ = fVar228;
  auVar211._12_4_ = fVar228;
  auVar211._16_4_ = fVar228;
  auVar211._20_4_ = fVar228;
  auVar211._24_4_ = fVar228;
  auVar211._28_4_ = fVar228;
  auVar79._8_4_ = 2;
  auVar79._0_8_ = 0x200000002;
  auVar79._12_4_ = 2;
  auVar79._16_4_ = 2;
  auVar79._20_4_ = 2;
  auVar79._24_4_ = 2;
  auVar79._28_4_ = 2;
  auVar73 = vpermps_avx512vl(auVar79,auVar84);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar75 = vpermps_avx512vl(auVar74,auVar84);
  auVar76 = vpermps_avx512vl(auVar79,auVar83);
  auVar77 = vpermps_avx512vl(auVar74,auVar83);
  auVar84 = vpermps_avx2(auVar79,auVar78);
  auVar78 = vpermps_avx512vl(auVar74,auVar78);
  auVar79 = vpermps_avx512vl(auVar79,auVar81);
  auVar80 = vpermps_avx512vl(auVar74,auVar81);
  auVar43 = vfmadd132ps_fma(auVar85,auVar141,_DAT_01f7b040);
  auVar85 = vsubps_avx(auVar252,ZEXT1632(auVar43));
  auVar74 = vmulps_avx512vl(auVar67,ZEXT1632(auVar43));
  auVar83 = ZEXT1632(auVar43);
  auVar81 = vmulps_avx512vl(auVar68,auVar83);
  auVar45 = vfmadd231ps_fma(auVar74,auVar85,auVar87);
  auVar46 = vfmadd231ps_fma(auVar81,auVar85,auVar82);
  auVar74 = vmulps_avx512vl(auVar69,auVar83);
  auVar81 = vmulps_avx512vl(auVar70,auVar83);
  auVar67 = vfmadd231ps_avx512vl(auVar74,auVar85,auVar67);
  auVar68 = vfmadd231ps_avx512vl(auVar81,auVar85,auVar68);
  auVar74 = vmulps_avx512vl(auVar71,auVar83);
  auVar87 = ZEXT1632(auVar43);
  auVar72 = vmulps_avx512vl(auVar72,auVar87);
  auVar69 = vfmadd231ps_avx512vl(auVar74,auVar85,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar72,auVar85,auVar70);
  fVar223 = auVar43._0_4_;
  fVar224 = auVar43._4_4_;
  auVar72._4_4_ = fVar224 * auVar67._4_4_;
  auVar72._0_4_ = fVar223 * auVar67._0_4_;
  fVar225 = auVar43._8_4_;
  auVar72._8_4_ = fVar225 * auVar67._8_4_;
  fVar226 = auVar43._12_4_;
  auVar72._12_4_ = fVar226 * auVar67._12_4_;
  auVar72._16_4_ = auVar67._16_4_ * 0.0;
  auVar72._20_4_ = auVar67._20_4_ * 0.0;
  auVar72._24_4_ = auVar67._24_4_ * 0.0;
  auVar72._28_4_ = fVar213;
  auVar74._4_4_ = fVar224 * auVar68._4_4_;
  auVar74._0_4_ = fVar223 * auVar68._0_4_;
  auVar74._8_4_ = fVar225 * auVar68._8_4_;
  auVar74._12_4_ = fVar226 * auVar68._12_4_;
  auVar74._16_4_ = auVar68._16_4_ * 0.0;
  auVar74._20_4_ = auVar68._20_4_ * 0.0;
  auVar74._24_4_ = auVar68._24_4_ * 0.0;
  auVar74._28_4_ = auVar82._28_4_;
  auVar45 = vfmadd231ps_fma(auVar72,auVar85,ZEXT1632(auVar45));
  auVar46 = vfmadd231ps_fma(auVar74,auVar85,ZEXT1632(auVar46));
  auVar86._0_4_ = fVar223 * auVar69._0_4_;
  auVar86._4_4_ = fVar224 * auVar69._4_4_;
  auVar86._8_4_ = fVar225 * auVar69._8_4_;
  auVar86._12_4_ = fVar226 * auVar69._12_4_;
  auVar86._16_4_ = auVar69._16_4_ * 0.0;
  auVar86._20_4_ = auVar69._20_4_ * 0.0;
  auVar86._24_4_ = auVar69._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar81._4_4_ = fVar224 * auVar70._4_4_;
  auVar81._0_4_ = fVar223 * auVar70._0_4_;
  auVar81._8_4_ = fVar225 * auVar70._8_4_;
  auVar81._12_4_ = fVar226 * auVar70._12_4_;
  auVar81._16_4_ = auVar70._16_4_ * 0.0;
  auVar81._20_4_ = auVar70._20_4_ * 0.0;
  auVar81._24_4_ = auVar70._24_4_ * 0.0;
  auVar81._28_4_ = auVar69._28_4_;
  auVar47 = vfmadd231ps_fma(auVar86,auVar85,auVar67);
  auVar52 = vfmadd231ps_fma(auVar81,auVar85,auVar68);
  auVar83._28_4_ = auVar68._28_4_;
  auVar83._0_28_ =
       ZEXT1628(CONCAT412(fVar226 * auVar52._12_4_,
                          CONCAT48(fVar225 * auVar52._8_4_,
                                   CONCAT44(fVar224 * auVar52._4_4_,fVar223 * auVar52._0_4_))));
  auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar226 * auVar47._12_4_,
                                               CONCAT48(fVar225 * auVar47._8_4_,
                                                        CONCAT44(fVar224 * auVar47._4_4_,
                                                                 fVar223 * auVar47._0_4_)))),auVar85
                            ,ZEXT1632(auVar45));
  auVar57 = vfmadd231ps_fma(auVar83,auVar85,ZEXT1632(auVar46));
  auVar82 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar45));
  auVar67 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar46));
  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar82 = vmulps_avx512vl(auVar82,auVar68);
  auVar67 = vmulps_avx512vl(auVar67,auVar68);
  auVar160._0_4_ = fVar228 * auVar82._0_4_;
  auVar160._4_4_ = fVar228 * auVar82._4_4_;
  auVar160._8_4_ = fVar228 * auVar82._8_4_;
  auVar160._12_4_ = fVar228 * auVar82._12_4_;
  auVar160._16_4_ = fVar228 * auVar82._16_4_;
  auVar160._20_4_ = fVar228 * auVar82._20_4_;
  auVar160._24_4_ = fVar228 * auVar82._24_4_;
  auVar160._28_4_ = 0;
  auVar82 = vmulps_avx512vl(auVar211,auVar67);
  auVar46 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
  auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar57),_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar118._0_4_ = auVar160._0_4_ + auVar55._0_4_;
  auVar118._4_4_ = auVar160._4_4_ + auVar55._4_4_;
  auVar118._8_4_ = auVar160._8_4_ + auVar55._8_4_;
  auVar118._12_4_ = auVar160._12_4_ + auVar55._12_4_;
  auVar118._16_4_ = auVar160._16_4_ + 0.0;
  auVar118._20_4_ = auVar160._20_4_ + 0.0;
  auVar118._24_4_ = auVar160._24_4_ + 0.0;
  auVar118._28_4_ = 0;
  auVar86 = ZEXT1632(auVar46);
  auVar70 = vpermt2ps_avx512vl(auVar160,_DAT_01fb9fc0,auVar86);
  auVar71 = vaddps_avx512vl(ZEXT1632(auVar57),auVar82);
  auVar72 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,auVar86);
  auVar82 = vsubps_avx(auVar67,auVar70);
  auVar70 = vsubps_avx512vl(auVar69,auVar72);
  auVar72 = vmulps_avx512vl(auVar76,auVar87);
  auVar74 = vmulps_avx512vl(auVar77,auVar87);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar85,auVar73);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar85,auVar75);
  auVar81 = vmulps_avx512vl(auVar84,auVar87);
  auVar83 = vmulps_avx512vl(auVar78,auVar87);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar85,auVar76);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar85,auVar77);
  auVar73 = vmulps_avx512vl(auVar79,auVar87);
  auVar75 = vmulps_avx512vl(auVar80,auVar87);
  auVar45 = vfmadd231ps_fma(auVar73,auVar85,auVar84);
  auVar84 = vfmadd231ps_avx512vl(auVar75,auVar85,auVar78);
  auVar73 = vmulps_avx512vl(auVar87,auVar81);
  auVar76 = ZEXT1632(auVar43);
  auVar75 = vmulps_avx512vl(auVar76,auVar83);
  auVar72 = vfmadd231ps_avx512vl(auVar73,auVar85,auVar72);
  auVar74 = vfmadd231ps_avx512vl(auVar75,auVar85,auVar74);
  auVar84 = vmulps_avx512vl(auVar76,auVar84);
  auVar81 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar226 * auVar45._12_4_,
                                          CONCAT48(fVar225 * auVar45._8_4_,
                                                   CONCAT44(fVar224 * auVar45._4_4_,
                                                            fVar223 * auVar45._0_4_)))),auVar85,
                       auVar81);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar85,auVar83);
  auVar73._4_4_ = fVar224 * auVar81._4_4_;
  auVar73._0_4_ = fVar223 * auVar81._0_4_;
  auVar73._8_4_ = fVar225 * auVar81._8_4_;
  auVar73._12_4_ = fVar226 * auVar81._12_4_;
  auVar73._16_4_ = auVar81._16_4_ * 0.0;
  auVar73._20_4_ = auVar81._20_4_ * 0.0;
  auVar73._24_4_ = auVar81._24_4_ * 0.0;
  auVar73._28_4_ = auVar78._28_4_;
  auVar83 = vmulps_avx512vl(auVar76,auVar84);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar85,auVar72);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar74,auVar85);
  auVar85 = vsubps_avx512vl(auVar81,auVar72);
  auVar84 = vsubps_avx512vl(auVar84,auVar74);
  auVar85 = vmulps_avx512vl(auVar85,auVar68);
  auVar84 = vmulps_avx512vl(auVar84,auVar68);
  fVar213 = fVar228 * auVar85._0_4_;
  fVar223 = fVar228 * auVar85._4_4_;
  auVar75._4_4_ = fVar223;
  auVar75._0_4_ = fVar213;
  fVar224 = fVar228 * auVar85._8_4_;
  auVar75._8_4_ = fVar224;
  fVar225 = fVar228 * auVar85._12_4_;
  auVar75._12_4_ = fVar225;
  fVar226 = fVar228 * auVar85._16_4_;
  auVar75._16_4_ = fVar226;
  fVar227 = fVar228 * auVar85._20_4_;
  auVar75._20_4_ = fVar227;
  fVar228 = fVar228 * auVar85._24_4_;
  auVar75._24_4_ = fVar228;
  auVar75._28_4_ = auVar85._28_4_;
  auVar84 = vmulps_avx512vl(auVar211,auVar84);
  auVar68 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,auVar86);
  auVar72 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar86);
  auVar212._0_4_ = auVar73._0_4_ + fVar213;
  auVar212._4_4_ = auVar73._4_4_ + fVar223;
  auVar212._8_4_ = auVar73._8_4_ + fVar224;
  auVar212._12_4_ = auVar73._12_4_ + fVar225;
  auVar212._16_4_ = auVar73._16_4_ + fVar226;
  auVar212._20_4_ = auVar73._20_4_ + fVar227;
  auVar212._24_4_ = auVar73._24_4_ + fVar228;
  auVar212._28_4_ = auVar73._28_4_ + auVar85._28_4_;
  auVar85 = vpermt2ps_avx512vl(auVar75,_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar74 = vaddps_avx512vl(auVar83,auVar84);
  auVar84 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,ZEXT1632(auVar46));
  auVar85 = vsubps_avx(auVar68,auVar85);
  auVar84 = vsubps_avx512vl(auVar72,auVar84);
  auVar262 = ZEXT3264(auVar84);
  auVar141 = ZEXT1632(auVar55);
  auVar81 = vsubps_avx512vl(auVar73,auVar141);
  auVar160 = ZEXT1632(auVar57);
  auVar75 = vsubps_avx512vl(auVar83,auVar160);
  auVar76 = vsubps_avx512vl(auVar68,auVar67);
  auVar81 = vaddps_avx512vl(auVar81,auVar76);
  auVar76 = vsubps_avx512vl(auVar72,auVar69);
  auVar75 = vaddps_avx512vl(auVar75,auVar76);
  auVar76 = vmulps_avx512vl(auVar160,auVar81);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar141,auVar75);
  auVar77 = vmulps_avx512vl(auVar71,auVar81);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar118,auVar75);
  auVar78 = vmulps_avx512vl(auVar70,auVar81);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar82,auVar75);
  auVar79 = vmulps_avx512vl(auVar69,auVar81);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar67,auVar75);
  auVar80 = vmulps_avx512vl(auVar83,auVar81);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar73,auVar75);
  auVar86 = vmulps_avx512vl(auVar74,auVar81);
  auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar212,auVar75);
  auVar87 = vmulps_avx512vl(auVar84,auVar81);
  auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar85,auVar75);
  auVar81 = vmulps_avx512vl(auVar72,auVar81);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar68,auVar75);
  auVar75 = vminps_avx512vl(auVar76,auVar77);
  auVar76 = vmaxps_avx512vl(auVar76,auVar77);
  auVar77 = vminps_avx512vl(auVar78,auVar79);
  auVar75 = vminps_avx512vl(auVar75,auVar77);
  auVar77 = vmaxps_avx512vl(auVar78,auVar79);
  auVar76 = vmaxps_avx512vl(auVar76,auVar77);
  auVar77 = vminps_avx512vl(auVar80,auVar86);
  auVar78 = vmaxps_avx512vl(auVar80,auVar86);
  auVar79 = vminps_avx512vl(auVar87,auVar81);
  auVar77 = vminps_avx512vl(auVar77,auVar79);
  auVar75 = vminps_avx512vl(auVar75,auVar77);
  auVar81 = vmaxps_avx512vl(auVar87,auVar81);
  auVar81 = vmaxps_avx512vl(auVar78,auVar81);
  auVar81 = vmaxps_avx512vl(auVar76,auVar81);
  auVar43 = auVar81._0_16_;
  uVar18 = vcmpps_avx512vl(auVar75,local_240,2);
  uVar19 = vcmpps_avx512vl(auVar81,local_260,5);
  bVar24 = (byte)uVar18 & (byte)uVar19 & 0x7f;
  if (bVar24 != 0) {
    auVar81 = vsubps_avx512vl(auVar67,auVar141);
    auVar75 = vsubps_avx512vl(auVar69,auVar160);
    auVar76 = vsubps_avx512vl(auVar68,auVar73);
    auVar81 = vaddps_avx512vl(auVar81,auVar76);
    auVar43 = auVar81._0_16_;
    auVar76 = vsubps_avx512vl(auVar72,auVar83);
    auVar75 = vaddps_avx512vl(auVar75,auVar76);
    auVar76 = vmulps_avx512vl(auVar160,auVar81);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar75,auVar141);
    auVar71 = vmulps_avx512vl(auVar71,auVar81);
    auVar71 = vfnmadd213ps_avx512vl(auVar118,auVar75,auVar71);
    auVar70 = vmulps_avx512vl(auVar70,auVar81);
    auVar70 = vfnmadd213ps_avx512vl(auVar82,auVar75,auVar70);
    auVar82 = vmulps_avx512vl(auVar69,auVar81);
    auVar69 = vfnmadd231ps_avx512vl(auVar82,auVar75,auVar67);
    auVar82 = vmulps_avx512vl(auVar83,auVar81);
    auVar83 = vfnmadd231ps_avx512vl(auVar82,auVar75,auVar73);
    auVar82 = vmulps_avx512vl(auVar74,auVar81);
    auVar74 = vfnmadd213ps_avx512vl(auVar212,auVar75,auVar82);
    auVar82 = vmulps_avx512vl(auVar84,auVar81);
    auVar73 = vfnmadd213ps_avx512vl(auVar85,auVar75,auVar82);
    auVar85 = vmulps_avx512vl(auVar72,auVar81);
    auVar72 = vfnmadd231ps_avx512vl(auVar85,auVar68,auVar75);
    auVar82 = vminps_avx(auVar76,auVar71);
    auVar85 = vmaxps_avx(auVar76,auVar71);
    auVar67 = vminps_avx(auVar70,auVar69);
    auVar67 = vminps_avx(auVar82,auVar67);
    auVar82 = vmaxps_avx(auVar70,auVar69);
    auVar85 = vmaxps_avx(auVar85,auVar82);
    auVar84 = vminps_avx(auVar83,auVar74);
    auVar82 = vmaxps_avx(auVar83,auVar74);
    auVar68 = vminps_avx(auVar73,auVar72);
    auVar84 = vminps_avx(auVar84,auVar68);
    auVar84 = vminps_avx(auVar67,auVar84);
    auVar67 = vmaxps_avx(auVar73,auVar72);
    auVar82 = vmaxps_avx(auVar82,auVar67);
    auVar85 = vmaxps_avx(auVar85,auVar82);
    uVar18 = vcmpps_avx512vl(auVar85,local_260,5);
    uVar19 = vcmpps_avx512vl(auVar84,local_240,2);
    bVar24 = bVar24 & (byte)uVar18 & (byte)uVar19;
    if (bVar24 != 0) {
      auStack_460[uVar26] = (uint)bVar24;
      uVar18 = vmovlps_avx(auVar53);
      (&uStack_220)[uVar26] = uVar18;
      uVar3 = vmovlps_avx(auVar39);
      auStack_1a0[uVar26] = uVar3;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
  }
  auVar53 = vxorps_avx512vl(auVar43,auVar43);
  auVar263 = ZEXT1664(auVar53);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar268 = ZEXT1664(auVar53);
  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar264 = ZEXT3264(auVar85);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar265 = ZEXT1664(auVar53);
  auVar266 = ZEXT464(0x3e2aaaab);
  auVar267 = ZEXT3264(_DAT_01fb9fe0);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar271 = ZEXT1664(auVar53);
LAB_018c3bc8:
  do {
    do {
      do {
        auVar43 = auVar263._0_16_;
        auVar45 = auVar268._0_16_;
        if ((int)uVar26 == 0) {
          if (bVar33) goto LAB_018c4ad8;
          uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar23._4_4_ = uVar100;
          auVar23._0_4_ = uVar100;
          auVar23._8_4_ = uVar100;
          auVar23._12_4_ = uVar100;
          uVar18 = vcmpps_avx512vl(local_3c0,auVar23,2);
          uVar32 = (ulong)((uint)uVar32 & (uint)uVar32 + 0xf & (uint)uVar18);
          goto LAB_018c2bc1;
        }
        uVar25 = (int)uVar26 - 1;
        uVar27 = (ulong)uVar25;
        uVar7 = auStack_460[uVar27];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auStack_1a0[uVar27];
        uVar3 = 0;
        for (uVar30 = (ulong)uVar7; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          uVar3 = uVar3 + 1;
        }
        uVar28 = uVar7 - 1 & uVar7;
        bVar36 = uVar28 == 0;
        auStack_460[uVar27] = uVar28;
        if (bVar36) {
          uVar26 = (ulong)uVar25;
        }
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar3;
        auVar53 = vpunpcklqdq_avx(auVar102,ZEXT416((int)uVar3 + 1));
        auVar53 = vcvtqq2ps_avx512vl(auVar53);
        auVar53 = vmulps_avx512vl(auVar53,auVar265._0_16_);
        uVar100 = *(undefined4 *)((long)&uStack_220 + uVar27 * 8 + 4);
        auVar20._4_4_ = uVar100;
        auVar20._0_4_ = uVar100;
        auVar20._8_4_ = uVar100;
        auVar20._12_4_ = uVar100;
        auVar46 = vmulps_avx512vl(auVar53,auVar20);
        auVar126._8_4_ = 0x3f800000;
        auVar126._0_8_ = 0x3f8000003f800000;
        auVar126._12_4_ = 0x3f800000;
        auVar53 = vsubps_avx(auVar126,auVar53);
        uVar100 = *(undefined4 *)(&uStack_220 + uVar27);
        auVar21._4_4_ = uVar100;
        auVar21._0_4_ = uVar100;
        auVar21._8_4_ = uVar100;
        auVar21._12_4_ = uVar100;
        auVar53 = vfmadd231ps_avx512vl(auVar46,auVar53,auVar21);
        auVar46 = vmovshdup_avx(auVar53);
        fVar228 = auVar46._0_4_ - auVar53._0_4_;
        auVar46 = vucomiss_avx512f(ZEXT416((uint)fVar228));
        auVar266 = ZEXT1664(auVar46);
        if (uVar7 == 0 || bVar36) goto LAB_018c36ca;
        auVar46 = vshufps_avx(auVar39,auVar39,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar228));
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar47 = vsubps_avx(auVar138,auVar46);
        fVar213 = auVar46._0_4_;
        auVar154._0_4_ = fVar213 * fVar134;
        fVar223 = auVar46._4_4_;
        auVar154._4_4_ = fVar223 * fVar143;
        fVar224 = auVar46._8_4_;
        auVar154._8_4_ = fVar224 * fVar134;
        fVar225 = auVar46._12_4_;
        auVar154._12_4_ = fVar225 * fVar143;
        auVar170._0_4_ = fVar213 * fVar119;
        auVar170._4_4_ = fVar223 * fVar131;
        auVar170._8_4_ = fVar224 * fVar119;
        auVar170._12_4_ = fVar225 * fVar131;
        auVar176._0_4_ = fVar213 * fVar132;
        auVar176._4_4_ = fVar223 * fVar133;
        auVar176._8_4_ = fVar224 * fVar132;
        auVar176._12_4_ = fVar225 * fVar133;
        auVar127._0_4_ = fVar213 * fVar229;
        auVar127._4_4_ = fVar223 * fVar241;
        auVar127._8_4_ = fVar224 * fVar229;
        auVar127._12_4_ = fVar225 * fVar241;
        auVar46 = vfmadd231ps_fma(auVar154,auVar47,auVar56);
        auVar52 = vfmadd231ps_fma(auVar170,auVar47,auVar44);
        auVar55 = vfmadd231ps_fma(auVar176,auVar47,auVar188);
        auVar47 = vfmadd231ps_fma(auVar127,auVar47,auVar198);
        auVar80._16_16_ = auVar46;
        auVar80._0_16_ = auVar46;
        auVar161._16_16_ = auVar52;
        auVar161._0_16_ = auVar52;
        auVar174._16_16_ = auVar55;
        auVar174._0_16_ = auVar55;
        auVar82 = vpermps_avx512vl(auVar267._0_32_,ZEXT1632(auVar53));
        auVar85 = vsubps_avx(auVar161,auVar80);
        auVar52 = vfmadd213ps_fma(auVar85,auVar82,auVar80);
        auVar85 = vsubps_avx(auVar174,auVar161);
        auVar57 = vfmadd213ps_fma(auVar85,auVar82,auVar161);
        auVar46 = vsubps_avx(auVar47,auVar55);
        auVar162._16_16_ = auVar46;
        auVar162._0_16_ = auVar46;
        auVar46 = vfmadd213ps_fma(auVar162,auVar82,auVar174);
        auVar85 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar52));
        auVar47 = vfmadd213ps_fma(auVar85,auVar82,ZEXT1632(auVar52));
        auVar85 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar57));
        auVar46 = vfmadd213ps_fma(auVar85,auVar82,ZEXT1632(auVar57));
        auVar85 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar47));
        auVar42 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar85,auVar82);
        auVar85 = vmulps_avx512vl(auVar85,auVar264._0_32_);
        auVar78._16_16_ = auVar85._16_16_;
        auVar46 = vmulss_avx512f(ZEXT416((uint)fVar228),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar213 = auVar46._0_4_;
        auVar177._0_8_ =
             CONCAT44(auVar42._4_4_ + fVar213 * auVar85._4_4_,
                      auVar42._0_4_ + fVar213 * auVar85._0_4_);
        auVar177._8_4_ = auVar42._8_4_ + fVar213 * auVar85._8_4_;
        auVar177._12_4_ = auVar42._12_4_ + fVar213 * auVar85._12_4_;
        auVar155._0_4_ = fVar213 * auVar85._16_4_;
        auVar155._4_4_ = fVar213 * auVar85._20_4_;
        auVar155._8_4_ = fVar213 * auVar85._24_4_;
        auVar155._12_4_ = fVar213 * auVar85._28_4_;
        auVar38 = vsubps_avx((undefined1  [16])0x0,auVar155);
        auVar57 = vshufpd_avx(auVar42,auVar42,3);
        auVar58 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar46 = vsubps_avx(auVar57,auVar42);
        auVar47 = vsubps_avx(auVar58,(undefined1  [16])0x0);
        auVar199._0_4_ = auVar46._0_4_ + auVar47._0_4_;
        auVar199._4_4_ = auVar46._4_4_ + auVar47._4_4_;
        auVar199._8_4_ = auVar46._8_4_ + auVar47._8_4_;
        auVar199._12_4_ = auVar46._12_4_ + auVar47._12_4_;
        auVar46 = vshufps_avx(auVar42,auVar42,0xb1);
        auVar47 = vshufps_avx(auVar177,auVar177,0xb1);
        auVar52 = vshufps_avx(auVar38,auVar38,0xb1);
        auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar249._4_4_ = auVar199._0_4_;
        auVar249._0_4_ = auVar199._0_4_;
        auVar249._8_4_ = auVar199._0_4_;
        auVar249._12_4_ = auVar199._0_4_;
        auVar59 = vshufps_avx(auVar199,auVar199,0x55);
        fVar213 = auVar59._0_4_;
        auVar209._0_4_ = auVar46._0_4_ * fVar213;
        fVar223 = auVar59._4_4_;
        auVar209._4_4_ = auVar46._4_4_ * fVar223;
        fVar224 = auVar59._8_4_;
        auVar209._8_4_ = auVar46._8_4_ * fVar224;
        fVar225 = auVar59._12_4_;
        auVar209._12_4_ = auVar46._12_4_ * fVar225;
        auVar215._0_4_ = auVar47._0_4_ * fVar213;
        auVar215._4_4_ = auVar47._4_4_ * fVar223;
        auVar215._8_4_ = auVar47._8_4_ * fVar224;
        auVar215._12_4_ = auVar47._12_4_ * fVar225;
        auVar235._0_4_ = auVar52._0_4_ * fVar213;
        auVar235._4_4_ = auVar52._4_4_ * fVar223;
        auVar235._8_4_ = auVar52._8_4_ * fVar224;
        auVar235._12_4_ = auVar52._12_4_ * fVar225;
        auVar200._0_4_ = auVar55._0_4_ * fVar213;
        auVar200._4_4_ = auVar55._4_4_ * fVar223;
        auVar200._8_4_ = auVar55._8_4_ * fVar224;
        auVar200._12_4_ = auVar55._12_4_ * fVar225;
        auVar46 = vfmadd231ps_fma(auVar209,auVar249,auVar42);
        auVar47 = vfmadd231ps_fma(auVar215,auVar249,auVar177);
        auVar40 = vfmadd231ps_fma(auVar235,auVar249,auVar38);
        auVar41 = vfmadd231ps_fma(auVar200,(undefined1  [16])0x0,auVar249);
        auVar59 = vshufpd_avx(auVar46,auVar46,1);
        auVar60 = vshufpd_avx(auVar47,auVar47,1);
        auVar63 = vshufpd_avx512vl(auVar40,auVar40,1);
        auVar64 = vshufpd_avx512vl(auVar41,auVar41,1);
        auVar262 = ZEXT1664(auVar64);
        auVar52 = vminss_avx(auVar46,auVar47);
        auVar46 = vmaxss_avx(auVar47,auVar46);
        auVar55 = vminss_avx(auVar40,auVar41);
        auVar47 = vmaxss_avx(auVar41,auVar40);
        auVar52 = vminss_avx(auVar52,auVar55);
        auVar46 = vmaxss_avx(auVar47,auVar46);
        auVar55 = vminss_avx(auVar59,auVar60);
        auVar47 = vmaxss_avx(auVar60,auVar59);
        auVar59 = vminss_avx512f(auVar63,auVar64);
        auVar60 = vmaxss_avx512f(auVar64,auVar63);
        auVar47 = vmaxss_avx(auVar60,auVar47);
        auVar55 = vminss_avx512f(auVar55,auVar59);
        vucomiss_avx512f(auVar52);
        fVar223 = auVar47._0_4_;
        fVar213 = auVar46._0_4_;
        if (4 < (uint)uVar26) {
          bVar37 = fVar223 == -0.0001;
          bVar34 = NAN(fVar223);
          if (fVar223 <= -0.0001) goto LAB_018c3dfe;
          break;
        }
LAB_018c3dfe:
        auVar59 = vucomiss_avx512f(auVar55);
        bVar37 = fVar223 <= -0.0001;
        bVar35 = -0.0001 < fVar213;
        bVar34 = bVar37;
        if (!bVar37) break;
        uVar18 = vcmpps_avx512vl(auVar52,auVar59,5);
        uVar19 = vcmpps_avx512vl(auVar55,auVar59,5);
        bVar24 = (byte)uVar18 & (byte)uVar19 & 1;
        bVar37 = bVar35 && bVar24 == 0;
        bVar34 = bVar35 && bVar24 == 0;
      } while (!bVar35 || bVar24 != 0);
      vcmpss_avx512f(auVar52,auVar43,1);
      auVar40 = auVar270._0_16_;
      uVar18 = vcmpss_avx512f(auVar46,auVar43,1);
      bVar35 = (bool)((byte)uVar18 & 1);
      auVar78._0_16_ = auVar40;
      iVar99 = auVar270._0_4_;
      auVar88._4_28_ = auVar78._4_28_;
      auVar88._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * iVar99);
      vucomiss_avx512f(auVar88._0_16_);
      bVar34 = (bool)(!bVar37 | bVar34);
      bVar35 = bVar34 == false;
      auVar90._16_16_ = auVar78._16_16_;
      auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (uint)bVar34 * auVar263._0_4_ + (uint)!bVar34 * 0x7f800000;
      auVar60 = auVar89._0_16_;
      auVar92._16_16_ = auVar78._16_16_;
      auVar92._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (uint)bVar34 * auVar263._0_4_ + (uint)!bVar34 * -0x800000;
      auVar59 = auVar91._0_16_;
      uVar18 = vcmpss_avx512f(auVar55,auVar43,1);
      bVar37 = (bool)((byte)uVar18 & 1);
      auVar94._16_16_ = auVar78._16_16_;
      auVar94._0_16_ = auVar40;
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar99);
      auVar55 = vucomiss_avx512f(auVar93._0_16_);
      auVar262 = ZEXT1664(auVar55);
      if ((bVar34) || (bVar35)) {
        auVar55 = vucomiss_avx512f(auVar52);
        if ((bVar34) || (bVar35)) {
          auVar41 = vxorps_avx512vl(auVar52,auVar271._0_16_);
          auVar262 = ZEXT1664(auVar41);
          auVar52 = vsubss_avx512f(auVar55,auVar52);
          auVar52 = vdivss_avx512f(auVar41,auVar52);
          auVar55 = vsubss_avx512f(auVar40,auVar52);
          auVar52 = vfmadd213ss_avx512f(auVar55,auVar43,auVar52);
          auVar55 = auVar52;
        }
        else {
          auVar55 = vxorps_avx512vl(auVar55,auVar55);
          vucomiss_avx512f(auVar55);
          if ((bVar34) || (auVar52 = auVar40, bVar35)) {
            auVar52 = SUB6416(ZEXT464(0xff800000),0);
            auVar55 = ZEXT416(0x7f800000);
          }
        }
        auVar60 = vminss_avx512f(auVar60,auVar55);
        auVar59 = vmaxss_avx(auVar52,auVar59);
      }
      uVar18 = vcmpss_avx512f(auVar47,auVar43,1);
      bVar37 = (bool)((byte)uVar18 & 1);
      fVar224 = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar99);
      if ((auVar88._0_4_ != fVar224) || (NAN(auVar88._0_4_) || NAN(fVar224))) {
        if ((fVar223 != fVar213) || (NAN(fVar223) || NAN(fVar213))) {
          auVar46 = vxorps_avx512vl(auVar46,auVar271._0_16_);
          auVar201._0_4_ = auVar46._0_4_ / (fVar223 - fVar213);
          auVar201._4_12_ = auVar46._4_12_;
          auVar46 = vsubss_avx512f(auVar40,auVar201);
          auVar46 = vfmadd213ss_avx512f(auVar46,auVar43,auVar201);
          auVar47 = auVar46;
        }
        else if ((fVar213 != 0.0) ||
                (auVar46 = auVar40, auVar47 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar213))) {
          auVar46 = SUB6416(ZEXT464(0xff800000),0);
          auVar47 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar60 = vminss_avx(auVar60,auVar47);
        auVar59 = vmaxss_avx(auVar46,auVar59);
      }
      bVar37 = auVar93._0_4_ != fVar224;
      auVar46 = vminss_avx512f(auVar60,auVar40);
      auVar96._16_16_ = auVar78._16_16_;
      auVar96._0_16_ = auVar60;
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar37 * auVar46._0_4_ + (uint)!bVar37 * auVar60._0_4_;
      auVar46 = vmaxss_avx512f(auVar40,auVar59);
      auVar98._16_16_ = auVar78._16_16_;
      auVar98._0_16_ = auVar59;
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (uint)bVar37 * auVar46._0_4_ + (uint)!bVar37 * auVar59._0_4_;
      auVar46 = vmaxss_avx512f(auVar43,auVar95._0_16_);
      auVar47 = vminss_avx512f(auVar97._0_16_,auVar40);
    } while (auVar47._0_4_ < auVar46._0_4_);
    auVar41 = vmaxss_avx512f(auVar43,ZEXT416((uint)(auVar46._0_4_ + -0.1)));
    auVar63 = vminss_avx512f(ZEXT416((uint)(auVar47._0_4_ + 0.1)),auVar40);
    auVar128._0_8_ = auVar42._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar216._8_8_ = auVar177._0_8_;
    auVar216._0_8_ = auVar177._0_8_;
    auVar236._8_8_ = auVar38._0_8_;
    auVar236._0_8_ = auVar38._0_8_;
    auVar46 = vshufpd_avx(auVar177,auVar177,3);
    auVar47 = vshufpd_avx(auVar38,auVar38,3);
    auVar52 = vshufps_avx(auVar41,auVar63,0);
    auVar250._8_4_ = 0x3f800000;
    auVar250._0_8_ = 0x3f8000003f800000;
    auVar250._12_4_ = 0x3f800000;
    auVar55 = vsubps_avx(auVar250,auVar52);
    fVar213 = auVar52._0_4_;
    auVar171._0_4_ = fVar213 * auVar57._0_4_;
    fVar223 = auVar52._4_4_;
    auVar171._4_4_ = fVar223 * auVar57._4_4_;
    fVar224 = auVar52._8_4_;
    auVar171._8_4_ = fVar224 * auVar57._8_4_;
    fVar225 = auVar52._12_4_;
    auVar171._12_4_ = fVar225 * auVar57._12_4_;
    auVar178._0_4_ = fVar213 * auVar46._0_4_;
    auVar178._4_4_ = fVar223 * auVar46._4_4_;
    auVar178._8_4_ = fVar224 * auVar46._8_4_;
    auVar178._12_4_ = fVar225 * auVar46._12_4_;
    auVar257._0_4_ = auVar47._0_4_ * fVar213;
    auVar257._4_4_ = auVar47._4_4_ * fVar223;
    auVar257._8_4_ = auVar47._8_4_ * fVar224;
    auVar257._12_4_ = auVar47._12_4_ * fVar225;
    auVar156._0_4_ = fVar213 * auVar58._0_4_;
    auVar156._4_4_ = fVar223 * auVar58._4_4_;
    auVar156._8_4_ = fVar224 * auVar58._8_4_;
    auVar156._12_4_ = fVar225 * auVar58._12_4_;
    auVar57 = vfmadd231ps_fma(auVar171,auVar55,auVar128);
    auVar58 = vfmadd231ps_fma(auVar178,auVar55,auVar216);
    auVar59 = vfmadd231ps_fma(auVar257,auVar55,auVar236);
    auVar60 = vfmadd231ps_fma(auVar156,auVar55,ZEXT816(0));
    auVar47 = vsubss_avx512f(auVar40,auVar41);
    auVar46 = vmovshdup_avx(auVar39);
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar41._0_4_)),auVar39,auVar47);
    auVar47 = vsubss_avx512f(auVar40,auVar63);
    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar63._0_4_)),auVar39,auVar47);
    auVar38 = vdivss_avx512f(auVar40,ZEXT416((uint)fVar228));
    auVar46 = vsubps_avx(auVar58,auVar57);
    auVar52 = vmulps_avx512vl(auVar46,auVar45);
    auVar46 = vsubps_avx(auVar59,auVar58);
    auVar55 = vmulps_avx512vl(auVar46,auVar45);
    auVar46 = vsubps_avx(auVar60,auVar59);
    auVar46 = vmulps_avx512vl(auVar46,auVar45);
    auVar47 = vminps_avx(auVar55,auVar46);
    auVar46 = vmaxps_avx(auVar55,auVar46);
    auVar47 = vminps_avx(auVar52,auVar47);
    auVar46 = vmaxps_avx(auVar52,auVar46);
    auVar52 = vshufpd_avx(auVar47,auVar47,3);
    auVar55 = vshufpd_avx(auVar46,auVar46,3);
    auVar47 = vminps_avx(auVar47,auVar52);
    auVar46 = vmaxps_avx(auVar46,auVar55);
    fVar228 = auVar38._0_4_;
    auVar202._0_4_ = auVar47._0_4_ * fVar228;
    auVar202._4_4_ = auVar47._4_4_ * fVar228;
    auVar202._8_4_ = auVar47._8_4_ * fVar228;
    auVar202._12_4_ = auVar47._12_4_ * fVar228;
    auVar189._0_4_ = fVar228 * auVar46._0_4_;
    auVar189._4_4_ = fVar228 * auVar46._4_4_;
    auVar189._8_4_ = fVar228 * auVar46._8_4_;
    auVar189._12_4_ = fVar228 * auVar46._12_4_;
    auVar38 = vdivss_avx512f(auVar40,ZEXT416((uint)(auVar63._0_4_ - auVar42._0_4_)));
    auVar46 = vshufpd_avx(auVar57,auVar57,3);
    auVar47 = vshufpd_avx(auVar58,auVar58,3);
    auVar52 = vshufpd_avx(auVar59,auVar59,3);
    auVar55 = vshufpd_avx(auVar60,auVar60,3);
    auVar46 = vsubps_avx(auVar46,auVar57);
    auVar57 = vsubps_avx(auVar47,auVar58);
    auVar58 = vsubps_avx(auVar52,auVar59);
    auVar55 = vsubps_avx(auVar55,auVar60);
    auVar47 = vminps_avx(auVar46,auVar57);
    auVar46 = vmaxps_avx(auVar46,auVar57);
    auVar52 = vminps_avx(auVar58,auVar55);
    auVar52 = vminps_avx(auVar47,auVar52);
    auVar47 = vmaxps_avx(auVar58,auVar55);
    auVar46 = vmaxps_avx(auVar46,auVar47);
    fVar228 = auVar38._0_4_;
    auVar237._0_4_ = fVar228 * auVar52._0_4_;
    auVar237._4_4_ = fVar228 * auVar52._4_4_;
    auVar237._8_4_ = fVar228 * auVar52._8_4_;
    auVar237._12_4_ = fVar228 * auVar52._12_4_;
    auVar217._0_4_ = fVar228 * auVar46._0_4_;
    auVar217._4_4_ = fVar228 * auVar46._4_4_;
    auVar217._8_4_ = fVar228 * auVar46._8_4_;
    auVar217._12_4_ = fVar228 * auVar46._12_4_;
    auVar55 = vinsertps_avx(auVar53,auVar42,0x10);
    auVar64 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9f90,auVar63);
    auVar111._0_4_ = auVar55._0_4_ + auVar64._0_4_;
    auVar111._4_4_ = auVar55._4_4_ + auVar64._4_4_;
    auVar111._8_4_ = auVar55._8_4_ + auVar64._8_4_;
    auVar111._12_4_ = auVar55._12_4_ + auVar64._12_4_;
    auVar22._8_4_ = 0x3f000000;
    auVar22._0_8_ = 0x3f0000003f000000;
    auVar22._12_4_ = 0x3f000000;
    auVar38 = vmulps_avx512vl(auVar111,auVar22);
    auVar47 = vshufps_avx(auVar38,auVar38,0x54);
    uVar100 = auVar38._0_4_;
    auVar114._4_4_ = uVar100;
    auVar114._0_4_ = uVar100;
    auVar114._8_4_ = uVar100;
    auVar114._12_4_ = uVar100;
    auVar52 = vfmadd213ps_fma(local_270,auVar114,auVar61);
    auVar57 = vfmadd213ps_fma(local_280,auVar114,auVar54);
    auVar58 = vfmadd213ps_fma(local_290,auVar114,auVar62);
    auVar46 = vsubps_avx(auVar57,auVar52);
    auVar52 = vfmadd213ps_fma(auVar46,auVar114,auVar52);
    auVar46 = vsubps_avx(auVar58,auVar57);
    auVar46 = vfmadd213ps_fma(auVar46,auVar114,auVar57);
    auVar46 = vsubps_avx(auVar46,auVar52);
    auVar52 = vfmadd231ps_fma(auVar52,auVar46,auVar114);
    auVar59 = vmulps_avx512vl(auVar46,auVar45);
    auVar243._8_8_ = auVar52._0_8_;
    auVar243._0_8_ = auVar52._0_8_;
    auVar46 = vshufpd_avx(auVar52,auVar52,3);
    auVar52 = vshufps_avx(auVar38,auVar38,0x55);
    auVar57 = vsubps_avx(auVar46,auVar243);
    auVar58 = vfmadd231ps_fma(auVar243,auVar52,auVar57);
    auVar258._8_8_ = auVar59._0_8_;
    auVar258._0_8_ = auVar59._0_8_;
    auVar46 = vshufpd_avx(auVar59,auVar59,3);
    auVar46 = vsubps_avx512vl(auVar46,auVar258);
    auVar46 = vfmadd213ps_avx512vl(auVar46,auVar52,auVar258);
    auVar115._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
    auVar115._8_4_ = auVar57._8_4_ ^ 0x80000000;
    auVar115._12_4_ = auVar57._12_4_ ^ 0x80000000;
    auVar52 = vmovshdup_avx512vl(auVar46);
    auVar259._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
    auVar259._8_4_ = auVar52._8_4_ ^ 0x80000000;
    auVar259._12_4_ = auVar52._12_4_ ^ 0x80000000;
    auVar59 = vmovshdup_avx512vl(auVar57);
    auVar60 = vpermt2ps_avx512vl(auVar259,ZEXT416(5),auVar57);
    auVar52 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar57._0_4_)),auVar46,auVar59);
    auVar57 = vpermt2ps_avx512vl(auVar46,SUB6416(ZEXT464(4),0),auVar115);
    auVar157._0_4_ = auVar52._0_4_;
    auVar157._4_4_ = auVar157._0_4_;
    auVar157._8_4_ = auVar157._0_4_;
    auVar157._12_4_ = auVar157._0_4_;
    auVar46 = vdivps_avx(auVar60,auVar157);
    auVar65 = vdivps_avx512vl(auVar57,auVar157);
    fVar228 = auVar58._0_4_;
    auVar52 = vshufps_avx(auVar58,auVar58,0x55);
    auVar244._0_4_ = fVar228 * auVar46._0_4_ + auVar52._0_4_ * auVar65._0_4_;
    auVar244._4_4_ = fVar228 * auVar46._4_4_ + auVar52._4_4_ * auVar65._4_4_;
    auVar244._8_4_ = fVar228 * auVar46._8_4_ + auVar52._8_4_ * auVar65._8_4_;
    auVar244._12_4_ = fVar228 * auVar46._12_4_ + auVar52._12_4_ * auVar65._12_4_;
    auVar39 = vsubps_avx(auVar47,auVar244);
    auVar52 = vmovshdup_avx(auVar46);
    auVar47 = vinsertps_avx(auVar202,auVar237,0x1c);
    auVar260._0_4_ = auVar52._0_4_ * auVar47._0_4_;
    auVar260._4_4_ = auVar52._4_4_ * auVar47._4_4_;
    auVar260._8_4_ = auVar52._8_4_ * auVar47._8_4_;
    auVar260._12_4_ = auVar52._12_4_ * auVar47._12_4_;
    auVar41 = vinsertps_avx512f(auVar189,auVar217,0x1c);
    auVar52 = vmulps_avx512vl(auVar52,auVar41);
    auVar60 = vminps_avx512vl(auVar260,auVar52);
    auVar58 = vmaxps_avx(auVar52,auVar260);
    auVar59 = vmovshdup_avx(auVar65);
    auVar52 = vinsertps_avx(auVar237,auVar202,0x4c);
    auVar238._0_4_ = auVar59._0_4_ * auVar52._0_4_;
    auVar238._4_4_ = auVar59._4_4_ * auVar52._4_4_;
    auVar238._8_4_ = auVar59._8_4_ * auVar52._8_4_;
    auVar238._12_4_ = auVar59._12_4_ * auVar52._12_4_;
    auVar57 = vinsertps_avx(auVar217,auVar189,0x4c);
    auVar218._0_4_ = auVar59._0_4_ * auVar57._0_4_;
    auVar218._4_4_ = auVar59._4_4_ * auVar57._4_4_;
    auVar218._8_4_ = auVar59._8_4_ * auVar57._8_4_;
    auVar218._12_4_ = auVar59._12_4_ * auVar57._12_4_;
    auVar59 = vminps_avx(auVar238,auVar218);
    auVar60 = vaddps_avx512vl(auVar60,auVar59);
    auVar59 = vmaxps_avx(auVar218,auVar238);
    auVar219._0_4_ = auVar58._0_4_ + auVar59._0_4_;
    auVar219._4_4_ = auVar58._4_4_ + auVar59._4_4_;
    auVar219._8_4_ = auVar58._8_4_ + auVar59._8_4_;
    auVar219._12_4_ = auVar58._12_4_ + auVar59._12_4_;
    auVar239._8_8_ = 0x3f80000000000000;
    auVar239._0_8_ = 0x3f80000000000000;
    auVar58 = vsubps_avx(auVar239,auVar219);
    auVar59 = vsubps_avx(auVar239,auVar60);
    auVar60 = vsubps_avx(auVar55,auVar38);
    auVar38 = vsubps_avx(auVar64,auVar38);
    fVar225 = auVar60._0_4_;
    auVar261._0_4_ = fVar225 * auVar58._0_4_;
    fVar226 = auVar60._4_4_;
    auVar261._4_4_ = fVar226 * auVar58._4_4_;
    fVar227 = auVar60._8_4_;
    auVar261._8_4_ = fVar227 * auVar58._8_4_;
    fVar182 = auVar60._12_4_;
    auVar261._12_4_ = fVar182 * auVar58._12_4_;
    auVar66 = vbroadcastss_avx512vl(auVar46);
    auVar47 = vmulps_avx512vl(auVar66,auVar47);
    auVar41 = vmulps_avx512vl(auVar66,auVar41);
    auVar66 = vminps_avx512vl(auVar47,auVar41);
    auVar41 = vmaxps_avx512vl(auVar41,auVar47);
    auVar47 = vbroadcastss_avx512vl(auVar65);
    auVar52 = vmulps_avx512vl(auVar47,auVar52);
    auVar47 = vmulps_avx512vl(auVar47,auVar57);
    auVar57 = vminps_avx512vl(auVar52,auVar47);
    auVar57 = vaddps_avx512vl(auVar66,auVar57);
    auVar60 = vmulps_avx512vl(auVar60,auVar59);
    auVar262 = ZEXT1664(auVar60);
    fVar228 = auVar38._0_4_;
    auVar220._0_4_ = fVar228 * auVar58._0_4_;
    fVar213 = auVar38._4_4_;
    auVar220._4_4_ = fVar213 * auVar58._4_4_;
    fVar223 = auVar38._8_4_;
    auVar220._8_4_ = fVar223 * auVar58._8_4_;
    fVar224 = auVar38._12_4_;
    auVar220._12_4_ = fVar224 * auVar58._12_4_;
    auVar240._0_4_ = fVar228 * auVar59._0_4_;
    auVar240._4_4_ = fVar213 * auVar59._4_4_;
    auVar240._8_4_ = fVar223 * auVar59._8_4_;
    auVar240._12_4_ = fVar224 * auVar59._12_4_;
    auVar47 = vmaxps_avx(auVar47,auVar52);
    auVar190._0_4_ = auVar41._0_4_ + auVar47._0_4_;
    auVar190._4_4_ = auVar41._4_4_ + auVar47._4_4_;
    auVar190._8_4_ = auVar41._8_4_ + auVar47._8_4_;
    auVar190._12_4_ = auVar41._12_4_ + auVar47._12_4_;
    auVar203._8_8_ = 0x3f800000;
    auVar203._0_8_ = 0x3f800000;
    auVar47 = vsubps_avx(auVar203,auVar190);
    auVar52 = vsubps_avx512vl(auVar203,auVar57);
    auVar251._0_4_ = fVar225 * auVar47._0_4_;
    auVar251._4_4_ = fVar226 * auVar47._4_4_;
    auVar251._8_4_ = fVar227 * auVar47._8_4_;
    auVar251._12_4_ = fVar182 * auVar47._12_4_;
    auVar245._0_4_ = fVar225 * auVar52._0_4_;
    auVar245._4_4_ = fVar226 * auVar52._4_4_;
    auVar245._8_4_ = fVar227 * auVar52._8_4_;
    auVar245._12_4_ = fVar182 * auVar52._12_4_;
    auVar191._0_4_ = fVar228 * auVar47._0_4_;
    auVar191._4_4_ = fVar213 * auVar47._4_4_;
    auVar191._8_4_ = fVar223 * auVar47._8_4_;
    auVar191._12_4_ = fVar224 * auVar47._12_4_;
    auVar204._0_4_ = fVar228 * auVar52._0_4_;
    auVar204._4_4_ = fVar213 * auVar52._4_4_;
    auVar204._8_4_ = fVar223 * auVar52._8_4_;
    auVar204._12_4_ = fVar224 * auVar52._12_4_;
    auVar47 = vminps_avx(auVar251,auVar245);
    auVar52 = vminps_avx512vl(auVar191,auVar204);
    auVar57 = vminps_avx512vl(auVar47,auVar52);
    auVar47 = vmaxps_avx(auVar245,auVar251);
    auVar52 = vmaxps_avx(auVar204,auVar191);
    auVar52 = vmaxps_avx(auVar52,auVar47);
    auVar58 = vminps_avx512vl(auVar261,auVar60);
    auVar47 = vminps_avx(auVar220,auVar240);
    auVar47 = vminps_avx(auVar58,auVar47);
    auVar47 = vhaddps_avx(auVar57,auVar47);
    auVar58 = vmaxps_avx512vl(auVar60,auVar261);
    auVar57 = vmaxps_avx(auVar240,auVar220);
    auVar57 = vmaxps_avx(auVar57,auVar58);
    auVar52 = vhaddps_avx(auVar52,auVar57);
    auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
    auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
    auVar192._0_4_ = auVar47._0_4_ + auVar39._0_4_;
    auVar192._4_4_ = auVar47._4_4_ + auVar39._4_4_;
    auVar192._8_4_ = auVar47._8_4_ + auVar39._8_4_;
    auVar192._12_4_ = auVar47._12_4_ + auVar39._12_4_;
    auVar205._0_4_ = auVar52._0_4_ + auVar39._0_4_;
    auVar205._4_4_ = auVar52._4_4_ + auVar39._4_4_;
    auVar205._8_4_ = auVar52._8_4_ + auVar39._8_4_;
    auVar205._12_4_ = auVar52._12_4_ + auVar39._12_4_;
    auVar47 = vmaxps_avx(auVar55,auVar192);
    auVar52 = vminps_avx(auVar205,auVar64);
    uVar3 = vcmpps_avx512vl(auVar52,auVar47,1);
  } while ((uVar3 & 3) != 0);
  uVar3 = vcmpps_avx512vl(auVar205,auVar64,1);
  uVar18 = vcmpps_avx512vl(auVar53,auVar192,1);
  if (((ushort)uVar18 & (ushort)uVar3 & 1) == 0) {
    bVar24 = 0;
  }
  else {
    auVar47 = vmovshdup_avx(auVar192);
    bVar24 = auVar42._0_4_ < auVar47._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar26 || uVar7 != 0 && !bVar36) | bVar24) != 1) goto LAB_018c4a59;
  lVar29 = 0xc9;
  do {
    lVar29 = lVar29 + -1;
    if (lVar29 == 0) goto LAB_018c3bc8;
    auVar53 = vsubss_avx512f(auVar40,auVar39);
    fVar223 = auVar53._0_4_;
    fVar228 = fVar223 * fVar223 * fVar223;
    auVar53 = vmulss_avx512f(auVar39,ZEXT416(0x40400000));
    fVar213 = auVar53._0_4_ * fVar223 * fVar223;
    fVar224 = auVar39._0_4_;
    auVar53 = vmulss_avx512f(ZEXT416((uint)(fVar224 * fVar224)),ZEXT416(0x40400000));
    fVar223 = fVar223 * auVar53._0_4_;
    auVar139._4_4_ = fVar228;
    auVar139._0_4_ = fVar228;
    auVar139._8_4_ = fVar228;
    auVar139._12_4_ = fVar228;
    auVar129._4_4_ = fVar213;
    auVar129._0_4_ = fVar213;
    auVar129._8_4_ = fVar213;
    auVar129._12_4_ = fVar213;
    auVar103._4_4_ = fVar223;
    auVar103._0_4_ = fVar223;
    auVar103._8_4_ = fVar223;
    auVar103._12_4_ = fVar223;
    fVar224 = fVar224 * fVar224 * fVar224;
    auVar172._0_4_ = (float)local_2a0._0_4_ * fVar224;
    auVar172._4_4_ = (float)local_2a0._4_4_ * fVar224;
    auVar172._8_4_ = fStack_298 * fVar224;
    auVar172._12_4_ = fStack_294 * fVar224;
    auVar53 = vfmadd231ps_fma(auVar172,auVar62,auVar103);
    auVar53 = vfmadd231ps_fma(auVar53,auVar54,auVar129);
    auVar53 = vfmadd231ps_fma(auVar53,auVar61,auVar139);
    auVar104._8_8_ = auVar53._0_8_;
    auVar104._0_8_ = auVar53._0_8_;
    auVar53 = vshufpd_avx(auVar53,auVar53,3);
    auVar47 = vshufps_avx(auVar39,auVar39,0x55);
    auVar53 = vsubps_avx(auVar53,auVar104);
    auVar47 = vfmadd213ps_fma(auVar53,auVar47,auVar104);
    fVar228 = auVar47._0_4_;
    auVar53 = vshufps_avx(auVar47,auVar47,0x55);
    auVar105._0_4_ = auVar46._0_4_ * fVar228 + auVar65._0_4_ * auVar53._0_4_;
    auVar105._4_4_ = auVar46._4_4_ * fVar228 + auVar65._4_4_ * auVar53._4_4_;
    auVar105._8_4_ = auVar46._8_4_ * fVar228 + auVar65._8_4_ * auVar53._8_4_;
    auVar105._12_4_ = auVar46._12_4_ * fVar228 + auVar65._12_4_ * auVar53._12_4_;
    auVar39 = vsubps_avx(auVar39,auVar105);
    auVar53 = vandps_avx512vl(auVar47,auVar269._0_16_);
    auVar47 = vprolq_avx512vl(auVar53,0x20);
    auVar53 = vmaxss_avx(auVar47,auVar53);
    bVar36 = (float)local_2b0._0_4_ < auVar53._0_4_;
  } while ((float)local_2b0._0_4_ <= auVar53._0_4_);
  auVar53 = vucomiss_avx512f(auVar43);
  if (bVar36) goto LAB_018c3bc8;
  auVar46 = vucomiss_avx512f(auVar53);
  auVar270 = ZEXT1664(auVar46);
  if (bVar36) goto LAB_018c3bc8;
  vmovshdup_avx(auVar53);
  auVar46 = vucomiss_avx512f(auVar43);
  if (bVar36) goto LAB_018c3bc8;
  auVar47 = vucomiss_avx512f(auVar46);
  auVar270 = ZEXT1664(auVar47);
  if (bVar36) goto LAB_018c3bc8;
  auVar52 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar39 = vinsertps_avx(auVar52,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar52 = vdpps_avx(auVar39,local_2c0,0x7f);
  auVar55 = vdpps_avx(auVar39,local_2d0,0x7f);
  auVar57 = vdpps_avx(auVar39,local_2e0,0x7f);
  auVar58 = vdpps_avx(auVar39,local_2f0,0x7f);
  auVar59 = vdpps_avx(auVar39,local_300,0x7f);
  auVar60 = vdpps_avx(auVar39,local_310,0x7f);
  auVar38 = vdpps_avx(auVar39,local_320,0x7f);
  auVar39 = vdpps_avx(auVar39,local_330,0x7f);
  auVar40 = vsubss_avx512f(auVar47,auVar46);
  fVar228 = auVar46._0_4_;
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar59._0_4_)),auVar40,auVar52);
  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar228)),auVar40,auVar55);
  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar228)),auVar40,auVar57);
  auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar39._0_4_)),auVar40,auVar58);
  auVar47 = vsubss_avx512f(auVar47,auVar53);
  auVar173._0_4_ = auVar47._0_4_;
  fVar228 = auVar173._0_4_ * auVar173._0_4_ * auVar173._0_4_;
  auVar47 = vmulss_avx512f(auVar53,ZEXT416(0x40400000));
  fVar213 = auVar47._0_4_ * auVar173._0_4_ * auVar173._0_4_;
  local_120 = auVar53._0_4_;
  auVar158._0_4_ = local_120 * local_120;
  auVar158._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar158._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar158._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  auVar47 = vmulss_avx512f(auVar158,ZEXT416(0x40400000));
  fVar223 = auVar173._0_4_ * auVar47._0_4_;
  fVar225 = local_120 * auVar158._0_4_;
  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * auVar57._0_4_)),ZEXT416((uint)fVar223),auVar55)
  ;
  auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar213),auVar52);
  auVar46 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar228),auVar46);
  fVar224 = auVar46._0_4_;
  if ((fVar224 < fVar144) || (fVar226 = *(float *)(ray + k * 4 + 0x100), fVar226 < fVar224))
  goto LAB_018c3bc8;
  auVar46 = vshufps_avx(auVar53,auVar53,0x55);
  auVar193._8_4_ = 0x3f800000;
  auVar193._0_8_ = 0x3f8000003f800000;
  auVar193._12_4_ = 0x3f800000;
  auVar47 = vsubps_avx(auVar193,auVar46);
  fVar227 = auVar46._0_4_;
  auVar206._0_4_ = fVar227 * (float)local_380._0_4_;
  fVar182 = auVar46._4_4_;
  auVar206._4_4_ = fVar182 * (float)local_380._4_4_;
  fVar183 = auVar46._8_4_;
  auVar206._8_4_ = fVar183 * fStack_378;
  fVar184 = auVar46._12_4_;
  auVar206._12_4_ = fVar184 * fStack_374;
  auVar210._0_4_ = fVar227 * (float)local_390._0_4_;
  auVar210._4_4_ = fVar182 * (float)local_390._4_4_;
  auVar210._8_4_ = fVar183 * fStack_388;
  auVar210._12_4_ = fVar184 * fStack_384;
  auVar221._0_4_ = fVar227 * (float)local_3a0._0_4_;
  auVar221._4_4_ = fVar182 * (float)local_3a0._4_4_;
  auVar221._8_4_ = fVar183 * fStack_398;
  auVar221._12_4_ = fVar184 * fStack_394;
  auVar179._0_4_ = fVar227 * (float)local_3b0._0_4_;
  auVar179._4_4_ = fVar182 * (float)local_3b0._4_4_;
  auVar179._8_4_ = fVar183 * fStack_3a8;
  auVar179._12_4_ = fVar184 * fStack_3a4;
  auVar46 = vfmadd231ps_fma(auVar206,auVar47,local_340);
  auVar52 = vfmadd231ps_fma(auVar210,auVar47,local_350);
  auVar55 = vfmadd231ps_fma(auVar221,auVar47,local_360);
  auVar57 = vfmadd231ps_fma(auVar179,auVar47,local_370);
  auVar46 = vsubps_avx(auVar52,auVar46);
  auVar47 = vsubps_avx(auVar55,auVar52);
  auVar52 = vsubps_avx(auVar57,auVar55);
  auVar222._0_4_ = local_120 * auVar47._0_4_;
  auVar222._4_4_ = local_120 * auVar47._4_4_;
  auVar222._8_4_ = local_120 * auVar47._8_4_;
  auVar222._12_4_ = local_120 * auVar47._12_4_;
  auVar173._4_4_ = auVar173._0_4_;
  auVar173._8_4_ = auVar173._0_4_;
  auVar173._12_4_ = auVar173._0_4_;
  auVar46 = vfmadd231ps_fma(auVar222,auVar173,auVar46);
  auVar180._0_4_ = local_120 * auVar52._0_4_;
  auVar180._4_4_ = local_120 * auVar52._4_4_;
  auVar180._8_4_ = local_120 * auVar52._8_4_;
  auVar180._12_4_ = local_120 * auVar52._12_4_;
  auVar47 = vfmadd231ps_fma(auVar180,auVar173,auVar47);
  auVar181._0_4_ = local_120 * auVar47._0_4_;
  auVar181._4_4_ = local_120 * auVar47._4_4_;
  auVar181._8_4_ = local_120 * auVar47._8_4_;
  auVar181._12_4_ = local_120 * auVar47._12_4_;
  auVar46 = vfmadd231ps_fma(auVar181,auVar173,auVar46);
  auVar45 = vmulps_avx512vl(auVar46,auVar45);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar24 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_018c4a51;
    auVar159._0_4_ = fVar225 * (float)local_400._0_4_;
    auVar159._4_4_ = fVar225 * (float)local_400._4_4_;
    auVar159._8_4_ = fVar225 * fStack_3f8;
    auVar159._12_4_ = fVar225 * fStack_3f4;
    auVar140._4_4_ = fVar223;
    auVar140._0_4_ = fVar223;
    auVar140._8_4_ = fVar223;
    auVar140._12_4_ = fVar223;
    auVar46 = vfmadd132ps_fma(auVar140,auVar159,local_3f0);
    auVar130._4_4_ = fVar213;
    auVar130._0_4_ = fVar213;
    auVar130._8_4_ = fVar213;
    auVar130._12_4_ = fVar213;
    auVar46 = vfmadd132ps_fma(auVar130,auVar46,local_3e0);
    auVar116._4_4_ = fVar228;
    auVar116._0_4_ = fVar228;
    auVar116._8_4_ = fVar228;
    auVar116._12_4_ = fVar228;
    auVar52 = vfmadd132ps_fma(auVar116,auVar46,local_3d0);
    auVar46 = vshufps_avx(auVar52,auVar52,0xc9);
    auVar47 = vshufps_avx(auVar45,auVar45,0xc9);
    auVar117._0_4_ = auVar52._0_4_ * auVar47._0_4_;
    auVar117._4_4_ = auVar52._4_4_ * auVar47._4_4_;
    auVar117._8_4_ = auVar52._8_4_ * auVar47._8_4_;
    auVar117._12_4_ = auVar52._12_4_ * auVar47._12_4_;
    auVar45 = vfmsub231ps_fma(auVar117,auVar45,auVar46);
    auVar142._8_4_ = 1;
    auVar142._0_8_ = 0x100000001;
    auVar142._12_4_ = 1;
    auVar142._16_4_ = 1;
    auVar142._20_4_ = 1;
    auVar142._24_4_ = 1;
    auVar142._28_4_ = 1;
    local_100 = vpermps_avx2(auVar142,ZEXT1632(auVar53));
    auVar85 = vpermps_avx2(auVar142,ZEXT1632(auVar45));
    auVar163._8_4_ = 2;
    auVar163._0_8_ = 0x200000002;
    auVar163._12_4_ = 2;
    auVar163._16_4_ = 2;
    auVar163._20_4_ = 2;
    auVar163._24_4_ = 2;
    auVar163._28_4_ = 2;
    local_160 = vpermps_avx2(auVar163,ZEXT1632(auVar45));
    local_140 = auVar45._0_4_;
    local_180[0] = (RTCHitN)auVar85[0];
    local_180[1] = (RTCHitN)auVar85[1];
    local_180[2] = (RTCHitN)auVar85[2];
    local_180[3] = (RTCHitN)auVar85[3];
    local_180[4] = (RTCHitN)auVar85[4];
    local_180[5] = (RTCHitN)auVar85[5];
    local_180[6] = (RTCHitN)auVar85[6];
    local_180[7] = (RTCHitN)auVar85[7];
    local_180[8] = (RTCHitN)auVar85[8];
    local_180[9] = (RTCHitN)auVar85[9];
    local_180[10] = (RTCHitN)auVar85[10];
    local_180[0xb] = (RTCHitN)auVar85[0xb];
    local_180[0xc] = (RTCHitN)auVar85[0xc];
    local_180[0xd] = (RTCHitN)auVar85[0xd];
    local_180[0xe] = (RTCHitN)auVar85[0xe];
    local_180[0xf] = (RTCHitN)auVar85[0xf];
    local_180[0x10] = (RTCHitN)auVar85[0x10];
    local_180[0x11] = (RTCHitN)auVar85[0x11];
    local_180[0x12] = (RTCHitN)auVar85[0x12];
    local_180[0x13] = (RTCHitN)auVar85[0x13];
    local_180[0x14] = (RTCHitN)auVar85[0x14];
    local_180[0x15] = (RTCHitN)auVar85[0x15];
    local_180[0x16] = (RTCHitN)auVar85[0x16];
    local_180[0x17] = (RTCHitN)auVar85[0x17];
    local_180[0x18] = (RTCHitN)auVar85[0x18];
    local_180[0x19] = (RTCHitN)auVar85[0x19];
    local_180[0x1a] = (RTCHitN)auVar85[0x1a];
    local_180[0x1b] = (RTCHitN)auVar85[0x1b];
    local_180[0x1c] = (RTCHitN)auVar85[0x1c];
    local_180[0x1d] = (RTCHitN)auVar85[0x1d];
    local_180[0x1e] = (RTCHitN)auVar85[0x1e];
    local_180[0x1f] = (RTCHitN)auVar85[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_1c0._0_8_;
    uStack_d8 = local_1c0._8_8_;
    uStack_d0 = local_1c0._16_8_;
    uStack_c8 = local_1c0._24_8_;
    local_c0 = local_1e0;
    vpcmpeqd_avx2(local_1e0,local_1e0);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar224;
    local_420 = local_200;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar8->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_450);
      auVar267 = ZEXT3264(_DAT_01fb9fe0);
      auVar266 = ZEXT464(0x3e2aaaab);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar265 = ZEXT1664(auVar53);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar264 = ZEXT3264(auVar85);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar271 = ZEXT1664(auVar53);
      auVar270 = ZEXT464(0x3f800000);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar268 = ZEXT1664(auVar53);
      auVar53 = vxorps_avx512vl(auVar43,auVar43);
      auVar263 = ZEXT1664(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar269 = ZEXT1664(auVar53);
    }
    auVar53 = auVar263._0_16_;
    if (local_420 != (undefined1  [32])0x0) {
      p_Var13 = context->args->filter;
      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var13)(&local_450);
        auVar267 = ZEXT3264(_DAT_01fb9fe0);
        auVar266 = ZEXT464(0x3e2aaaab);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar265 = ZEXT1664(auVar43);
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar264 = ZEXT3264(auVar85);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar271 = ZEXT1664(auVar43);
        auVar270 = ZEXT464(0x3f800000);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar268 = ZEXT1664(auVar43);
        auVar53 = vxorps_avx512vl(auVar53,auVar53);
        auVar263 = ZEXT1664(auVar53);
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar269 = ZEXT1664(auVar53);
      }
      uVar3 = vptestmd_avx512vl(local_420,local_420);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar36 = (bool)((byte)uVar3 & 1);
      bVar37 = (bool)((byte)(uVar3 >> 1) & 1);
      bVar34 = (bool)((byte)(uVar3 >> 2) & 1);
      bVar35 = (bool)((byte)(uVar3 >> 3) & 1);
      bVar14 = (bool)((byte)(uVar3 >> 4) & 1);
      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
      bVar17 = SUB81(uVar3 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar36 * auVar85._0_4_ | (uint)!bVar36 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar37 * auVar85._4_4_ | (uint)!bVar37 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar34 * auVar85._8_4_ | (uint)!bVar34 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar35 * auVar85._12_4_ | (uint)!bVar35 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar15 * auVar85._20_4_ | (uint)!bVar15 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar16 * auVar85._24_4_ | (uint)!bVar16 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar17 * auVar85._28_4_ | (uint)!bVar17 * *(int *)(local_450.ray + 0x11c);
      bVar24 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_018c4a51;
    }
    *(float *)(ray + k * 4 + 0x100) = fVar226;
  }
  bVar24 = 0;
LAB_018c4a51:
  bVar33 = (bool)(bVar33 | bVar24);
  goto LAB_018c3bc8;
LAB_018c4a59:
  auVar39 = vinsertps_avx(auVar42,auVar63,0x10);
  goto LAB_018c36ca;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }